

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  BBox1f BVar4;
  Primitive PVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  uint uVar52;
  uint uVar53;
  ulong uVar54;
  long lVar55;
  ulong uVar56;
  undefined4 uVar57;
  undefined8 unaff_RBP;
  uint uVar58;
  uint uVar59;
  float fVar60;
  float fVar61;
  float fVar90;
  vint4 bi_2;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar91;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar67 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar98 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 extraout_var [56];
  vint4 ai;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float t1;
  float fVar144;
  float fVar154;
  float fVar155;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar156;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  vint4 bi;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar174;
  float fVar190;
  float fVar191;
  vint4 ai_2;
  undefined1 auVar175 [16];
  float fVar192;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar193;
  float fVar207;
  float fVar208;
  vint4 ai_1;
  undefined1 auVar194 [16];
  float fVar209;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  vfloat4 b0;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  float fVar222;
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  float fVar246;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar248;
  float fVar249;
  float fVar250;
  undefined1 auVar244 [32];
  float fVar247;
  undefined1 auVar245 [32];
  float fVar251;
  float fVar258;
  float fVar259;
  vfloat4 a0_1;
  float fVar260;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [32];
  float fVar261;
  float fVar269;
  float fVar270;
  __m128 a;
  float fVar271;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  float fVar272;
  float fVar277;
  float fVar278;
  float fVar279;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar291;
  float fVar292;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  float fVar299;
  float fVar300;
  float fVar301;
  undefined1 auVar298 [64];
  float fVar306;
  vfloat4 a0;
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [64];
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float fStack_580;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  undefined1 local_498 [16];
  undefined1 (*local_480) [16];
  ulong local_478;
  long local_470;
  RTCFilterFunctionNArguments args;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  uint mask_stack [4];
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  vfloat_impl<4> p03;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  BBox1f cu_stack [4];
  RTCHitN local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  BBox1f cv_stack [4];
  undefined1 auVar206 [32];
  undefined1 auVar297 [32];
  
  PVar5 = prim[1];
  uVar54 = (ulong)(byte)PVar5;
  auVar216 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar216 = vinsertps_avx(auVar216,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar216 = vsubps_avx(auVar216,*(undefined1 (*) [16])(prim + uVar54 * 0x19 + 6));
  fVar174 = *(float *)(prim + uVar54 * 0x19 + 0x12);
  auVar92._0_4_ = fVar174 * auVar216._0_4_;
  auVar92._4_4_ = fVar174 * auVar216._4_4_;
  auVar92._8_4_ = fVar174 * auVar216._8_4_;
  auVar92._12_4_ = fVar174 * auVar216._12_4_;
  auVar216 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 4 + 6)));
  auVar210._0_4_ = fVar174 * auVar10._0_4_;
  auVar210._4_4_ = fVar174 * auVar10._4_4_;
  auVar210._8_4_ = fVar174 * auVar10._8_4_;
  auVar210._12_4_ = fVar174 * auVar10._12_4_;
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 5 + 6)));
  auVar216 = vcvtdq2ps_avx(auVar216);
  auVar263 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 6 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0xb + 6)));
  auVar263 = vcvtdq2ps_avx(auVar263);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0xc + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0xd + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x12 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x13 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x14 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar62 = vshufps_avx(auVar210,auVar210,0);
  auVar93 = vshufps_avx(auVar210,auVar210,0x55);
  auVar118 = vshufps_avx(auVar210,auVar210,0xaa);
  fVar174 = auVar118._0_4_;
  fVar144 = auVar118._4_4_;
  fVar190 = auVar118._8_4_;
  fVar154 = auVar118._12_4_;
  fVar193 = auVar93._0_4_;
  fVar207 = auVar93._4_4_;
  fVar208 = auVar93._8_4_;
  fVar209 = auVar93._12_4_;
  fVar191 = auVar62._0_4_;
  fVar155 = auVar62._4_4_;
  fVar192 = auVar62._8_4_;
  fVar156 = auVar62._12_4_;
  auVar141._0_4_ = fVar191 * auVar216._0_4_ + fVar193 * auVar10._0_4_ + fVar174 * auVar263._0_4_;
  auVar141._4_4_ = fVar155 * auVar216._4_4_ + fVar207 * auVar10._4_4_ + fVar144 * auVar263._4_4_;
  auVar141._8_4_ = fVar192 * auVar216._8_4_ + fVar208 * auVar10._8_4_ + fVar190 * auVar263._8_4_;
  auVar141._12_4_ = fVar156 * auVar216._12_4_ + fVar209 * auVar10._12_4_ + fVar154 * auVar263._12_4_
  ;
  auVar111._0_4_ = fVar191 * auVar11._0_4_ + fVar193 * auVar12._0_4_ + auVar13._0_4_ * fVar174;
  auVar111._4_4_ = fVar155 * auVar11._4_4_ + fVar207 * auVar12._4_4_ + auVar13._4_4_ * fVar144;
  auVar111._8_4_ = fVar192 * auVar11._8_4_ + fVar208 * auVar12._8_4_ + auVar13._8_4_ * fVar190;
  auVar111._12_4_ = fVar156 * auVar11._12_4_ + fVar209 * auVar12._12_4_ + auVar13._12_4_ * fVar154;
  auVar211._0_4_ = fVar191 * auVar63._0_4_ + fVar193 * auVar64._0_4_ + auVar94._0_4_ * fVar174;
  auVar211._4_4_ = fVar155 * auVar63._4_4_ + fVar207 * auVar64._4_4_ + auVar94._4_4_ * fVar144;
  auVar211._8_4_ = fVar192 * auVar63._8_4_ + fVar208 * auVar64._8_4_ + auVar94._8_4_ * fVar190;
  auVar211._12_4_ = fVar156 * auVar63._12_4_ + fVar209 * auVar64._12_4_ + auVar94._12_4_ * fVar154;
  auVar62 = vshufps_avx(auVar92,auVar92,0);
  auVar93 = vshufps_avx(auVar92,auVar92,0x55);
  auVar118 = vshufps_avx(auVar92,auVar92,0xaa);
  fVar174 = auVar118._0_4_;
  fVar144 = auVar118._4_4_;
  fVar190 = auVar118._8_4_;
  fVar154 = auVar118._12_4_;
  fVar193 = auVar93._0_4_;
  fVar207 = auVar93._4_4_;
  fVar208 = auVar93._8_4_;
  fVar209 = auVar93._12_4_;
  fVar191 = auVar62._0_4_;
  fVar155 = auVar62._4_4_;
  fVar192 = auVar62._8_4_;
  fVar156 = auVar62._12_4_;
  auVar157._0_4_ = fVar191 * auVar216._0_4_ + fVar193 * auVar10._0_4_ + fVar174 * auVar263._0_4_;
  auVar157._4_4_ = fVar155 * auVar216._4_4_ + fVar207 * auVar10._4_4_ + fVar144 * auVar263._4_4_;
  auVar157._8_4_ = fVar192 * auVar216._8_4_ + fVar208 * auVar10._8_4_ + fVar190 * auVar263._8_4_;
  auVar157._12_4_ = fVar156 * auVar216._12_4_ + fVar209 * auVar10._12_4_ + fVar154 * auVar263._12_4_
  ;
  auVar93._0_4_ = fVar191 * auVar11._0_4_ + auVar13._0_4_ * fVar174 + fVar193 * auVar12._0_4_;
  auVar93._4_4_ = fVar155 * auVar11._4_4_ + auVar13._4_4_ * fVar144 + fVar207 * auVar12._4_4_;
  auVar93._8_4_ = fVar192 * auVar11._8_4_ + auVar13._8_4_ * fVar190 + fVar208 * auVar12._8_4_;
  auVar93._12_4_ = fVar156 * auVar11._12_4_ + auVar13._12_4_ * fVar154 + fVar209 * auVar12._12_4_;
  auVar62._0_4_ = fVar193 * auVar64._0_4_ + auVar94._0_4_ * fVar174 + fVar191 * auVar63._0_4_;
  auVar62._4_4_ = fVar207 * auVar64._4_4_ + auVar94._4_4_ * fVar144 + fVar155 * auVar63._4_4_;
  auVar62._8_4_ = fVar208 * auVar64._8_4_ + auVar94._8_4_ * fVar190 + fVar192 * auVar63._8_4_;
  auVar62._12_4_ = fVar209 * auVar64._12_4_ + auVar94._12_4_ * fVar154 + fVar156 * auVar63._12_4_;
  auVar194._8_4_ = 0x7fffffff;
  auVar194._0_8_ = 0x7fffffff7fffffff;
  auVar194._12_4_ = 0x7fffffff;
  auVar216 = vandps_avx(auVar141,auVar194);
  auVar145._8_4_ = 0x219392ef;
  auVar145._0_8_ = 0x219392ef219392ef;
  auVar145._12_4_ = 0x219392ef;
  auVar216 = vcmpps_avx(auVar216,auVar145,1);
  auVar10 = vblendvps_avx(auVar141,auVar145,auVar216);
  auVar216 = vandps_avx(auVar111,auVar194);
  auVar216 = vcmpps_avx(auVar216,auVar145,1);
  auVar263 = vblendvps_avx(auVar111,auVar145,auVar216);
  auVar216 = vandps_avx(auVar211,auVar194);
  auVar216 = vcmpps_avx(auVar216,auVar145,1);
  auVar216 = vblendvps_avx(auVar211,auVar145,auVar216);
  auVar11 = vrcpps_avx(auVar10);
  fVar193 = auVar11._0_4_;
  auVar118._0_4_ = fVar193 * auVar10._0_4_;
  fVar207 = auVar11._4_4_;
  auVar118._4_4_ = fVar207 * auVar10._4_4_;
  fVar208 = auVar11._8_4_;
  auVar118._8_4_ = fVar208 * auVar10._8_4_;
  fVar209 = auVar11._12_4_;
  auVar118._12_4_ = fVar209 * auVar10._12_4_;
  auVar71._8_4_ = 0x3f800000;
  auVar71._0_8_ = 0x3f8000003f800000;
  auVar71._12_4_ = 0x3f800000;
  auVar10 = vsubps_avx(auVar71,auVar118);
  fVar193 = fVar193 + fVar193 * auVar10._0_4_;
  fVar207 = fVar207 + fVar207 * auVar10._4_4_;
  fVar208 = fVar208 + fVar208 * auVar10._8_4_;
  fVar209 = fVar209 + fVar209 * auVar10._12_4_;
  auVar10 = vrcpps_avx(auVar263);
  fVar174 = auVar10._0_4_;
  auVar175._0_4_ = fVar174 * auVar263._0_4_;
  fVar190 = auVar10._4_4_;
  auVar175._4_4_ = fVar190 * auVar263._4_4_;
  fVar191 = auVar10._8_4_;
  auVar175._8_4_ = fVar191 * auVar263._8_4_;
  fVar192 = auVar10._12_4_;
  auVar175._12_4_ = fVar192 * auVar263._12_4_;
  auVar10 = vsubps_avx(auVar71,auVar175);
  fVar174 = fVar174 + fVar174 * auVar10._0_4_;
  fVar190 = fVar190 + fVar190 * auVar10._4_4_;
  fVar191 = fVar191 + fVar191 * auVar10._8_4_;
  fVar192 = fVar192 + fVar192 * auVar10._12_4_;
  auVar10 = vrcpps_avx(auVar216);
  fVar144 = auVar10._0_4_;
  auVar146._0_4_ = fVar144 * auVar216._0_4_;
  fVar154 = auVar10._4_4_;
  auVar146._4_4_ = fVar154 * auVar216._4_4_;
  fVar155 = auVar10._8_4_;
  auVar146._8_4_ = fVar155 * auVar216._8_4_;
  fVar156 = auVar10._12_4_;
  auVar146._12_4_ = fVar156 * auVar216._12_4_;
  auVar216 = vsubps_avx(auVar71,auVar146);
  fVar144 = fVar144 + fVar144 * auVar216._0_4_;
  fVar154 = fVar154 + fVar154 * auVar216._4_4_;
  fVar155 = fVar155 + fVar155 * auVar216._8_4_;
  fVar156 = fVar156 + fVar156 * auVar216._12_4_;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = *(ulong *)(prim + uVar54 * 7 + 6);
  auVar216 = vpmovsxwd_avx(auVar216);
  auVar216 = vcvtdq2ps_avx(auVar216);
  auVar263 = vsubps_avx(auVar216,auVar157);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar54 * 9 + 6);
  auVar216 = vpmovsxwd_avx(auVar10);
  auVar119._0_4_ = fVar193 * auVar263._0_4_;
  auVar119._4_4_ = fVar207 * auVar263._4_4_;
  auVar119._8_4_ = fVar208 * auVar263._8_4_;
  auVar119._12_4_ = fVar209 * auVar263._12_4_;
  auVar216 = vcvtdq2ps_avx(auVar216);
  auVar216 = vsubps_avx(auVar216,auVar157);
  auVar158._0_4_ = fVar193 * auVar216._0_4_;
  auVar158._4_4_ = fVar207 * auVar216._4_4_;
  auVar158._8_4_ = fVar208 * auVar216._8_4_;
  auVar158._12_4_ = fVar209 * auVar216._12_4_;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = *(ulong *)(prim + uVar54 * 0xe + 6);
  auVar216 = vpmovsxwd_avx(auVar263);
  auVar216 = vcvtdq2ps_avx(auVar216);
  auVar10 = vsubps_avx(auVar216,auVar93);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  auVar216 = vpmovsxwd_avx(auVar11);
  auVar195._0_4_ = auVar10._0_4_ * fVar174;
  auVar195._4_4_ = auVar10._4_4_ * fVar190;
  auVar195._8_4_ = auVar10._8_4_ * fVar191;
  auVar195._12_4_ = auVar10._12_4_ * fVar192;
  auVar216 = vcvtdq2ps_avx(auVar216);
  auVar216 = vsubps_avx(auVar216,auVar93);
  auVar94._0_4_ = fVar174 * auVar216._0_4_;
  auVar94._4_4_ = fVar190 * auVar216._4_4_;
  auVar94._8_4_ = fVar191 * auVar216._8_4_;
  auVar94._12_4_ = fVar192 * auVar216._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar54 * 0x15 + 6);
  auVar216 = vpmovsxwd_avx(auVar12);
  auVar216 = vcvtdq2ps_avx(auVar216);
  auVar216 = vsubps_avx(auVar216,auVar62);
  auVar176._0_4_ = auVar216._0_4_ * fVar144;
  auVar176._4_4_ = auVar216._4_4_ * fVar154;
  auVar176._8_4_ = auVar216._8_4_ * fVar155;
  auVar176._12_4_ = auVar216._12_4_ * fVar156;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar54 * 0x17 + 6);
  auVar216 = vpmovsxwd_avx(auVar13);
  auVar216 = vcvtdq2ps_avx(auVar216);
  auVar216 = vsubps_avx(auVar216,auVar62);
  auVar63._0_4_ = auVar216._0_4_ * fVar144;
  auVar63._4_4_ = auVar216._4_4_ * fVar154;
  auVar63._8_4_ = auVar216._8_4_ * fVar155;
  auVar63._12_4_ = auVar216._12_4_ * fVar156;
  auVar216 = vpminsd_avx(auVar119,auVar158);
  auVar10 = vpminsd_avx(auVar195,auVar94);
  auVar216 = vmaxps_avx(auVar216,auVar10);
  auVar10 = vpminsd_avx(auVar176,auVar63);
  uVar57 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar235._4_4_ = uVar57;
  auVar235._0_4_ = uVar57;
  auVar235._8_4_ = uVar57;
  auVar235._12_4_ = uVar57;
  auVar10 = vmaxps_avx(auVar10,auVar235);
  auVar216 = vmaxps_avx(auVar216,auVar10);
  auVar147._0_4_ = auVar216._0_4_ * 0.99999964;
  auVar147._4_4_ = auVar216._4_4_ * 0.99999964;
  auVar147._8_4_ = auVar216._8_4_ * 0.99999964;
  auVar147._12_4_ = auVar216._12_4_ * 0.99999964;
  auVar216 = vpmaxsd_avx(auVar119,auVar158);
  auVar10 = vpmaxsd_avx(auVar195,auVar94);
  auVar216 = vminps_avx(auVar216,auVar10);
  auVar10 = vpmaxsd_avx(auVar176,auVar63);
  uVar57 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar120._4_4_ = uVar57;
  auVar120._0_4_ = uVar57;
  auVar120._8_4_ = uVar57;
  auVar120._12_4_ = uVar57;
  auVar10 = vminps_avx(auVar10,auVar120);
  auVar216 = vminps_avx(auVar216,auVar10);
  auVar64._0_4_ = auVar216._0_4_ * 1.0000004;
  auVar64._4_4_ = auVar216._4_4_ * 1.0000004;
  auVar64._8_4_ = auVar216._8_4_ * 1.0000004;
  auVar64._12_4_ = auVar216._12_4_ * 1.0000004;
  auVar216 = vpshufd_avx(ZEXT116((byte)PVar5),0);
  auVar10 = vpcmpgtd_avx(auVar216,_DAT_01f4ad30);
  auVar216 = vcmpps_avx(auVar147,auVar64,2);
  auVar216 = vandps_avx(auVar216,auVar10);
  uVar57 = vmovmskps_avx(auVar216);
  uVar54 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar57);
  auVar84._16_16_ = mm_lookupmask_ps._240_16_;
  auVar84._0_16_ = mm_lookupmask_ps._240_16_;
  local_198 = vblendps_avx(auVar84,ZEXT832(0) << 0x20,0x80);
  local_480 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
LAB_007f8e45:
  if (uVar54 == 0) {
    return;
  }
  lVar55 = 0;
  if (uVar54 != 0) {
    for (; (uVar54 >> lVar55 & 1) == 0; lVar55 = lVar55 + 1) {
    }
  }
  uVar53 = *(uint *)(prim + 2);
  local_478 = (ulong)*(uint *)(prim + lVar55 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar53].ptr;
  lVar7 = *(long *)&pGVar6[1].time_range.upper;
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           local_478 *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  pfVar2 = (float *)(lVar7 + (long)pGVar6[1].intersectionFilterN * uVar56);
  fVar193 = *pfVar2;
  fVar207 = pfVar2[1];
  fVar208 = pfVar2[2];
  fVar209 = pfVar2[3];
  lVar1 = uVar56 + 1;
  auVar216 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * lVar1);
  pfVar2 = (float *)(pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * uVar56);
  _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar3 = (float *)(pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * lVar1);
  auVar121._0_4_ = *pfVar3 * 0.33333334;
  auVar121._4_4_ = pfVar3[1] * 0.33333334;
  auVar121._8_4_ = pfVar3[2] * 0.33333334;
  auVar121._12_4_ = pfVar3[3] * 0.33333334;
  pfVar3 = (float *)(_Var8 + (long)pGVar6[2].userPtr * uVar56);
  fVar60 = *pfVar3;
  fVar61 = pfVar3[1];
  fVar90 = pfVar3[2];
  fVar91 = pfVar3[3];
  pfVar3 = (float *)((long)pGVar6[3].userPtr + uVar56 * *(long *)&pGVar6[3].fnumTimeSegments);
  auVar10 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * lVar1);
  auVar263 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar11 = vinsertps_avx(auVar263,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar222 = fVar193 + *pfVar2 * 0.33333334;
  fVar232 = fVar207 + pfVar2[1] * 0.33333334;
  fVar233 = fVar208 + pfVar2[2] * 0.33333334;
  fVar234 = fVar209 + pfVar2[3] * 0.33333334;
  auVar263 = vsubps_avx(auVar216,auVar121);
  fVar251 = fVar60 + *pfVar3 * 0.33333334;
  fVar258 = fVar61 + pfVar3[1] * 0.33333334;
  fVar259 = fVar90 + pfVar3[2] * 0.33333334;
  fVar260 = fVar91 + pfVar3[3] * 0.33333334;
  pfVar2 = (float *)((long)pGVar6[3].userPtr + *(long *)&pGVar6[3].fnumTimeSegments * lVar1);
  auVar95._0_4_ = *pfVar2 * 0.33333334;
  auVar95._4_4_ = pfVar2[1] * 0.33333334;
  auVar95._8_4_ = pfVar2[2] * 0.33333334;
  auVar95._12_4_ = pfVar2[3] * 0.33333334;
  auVar12 = vsubps_avx(auVar10,auVar95);
  fVar174 = auVar216._0_4_;
  fVar190 = auVar216._4_4_;
  fVar191 = auVar216._8_4_;
  fVar192 = auVar216._12_4_;
  fVar261 = auVar263._0_4_ * 0.0;
  fVar269 = auVar263._4_4_ * 0.0;
  fVar270 = auVar263._8_4_ * 0.0;
  fVar271 = auVar263._12_4_ * 0.0;
  fVar144 = fVar261 + fVar174 * 0.0;
  fVar154 = fVar269 + fVar190 * 0.0;
  fVar155 = fVar270 + fVar191 * 0.0;
  fVar156 = fVar271 + fVar192 * 0.0;
  fVar272 = fVar222 * 0.0;
  fVar277 = fVar232 * 0.0;
  fVar278 = fVar233 * 0.0;
  fVar279 = fVar234 * 0.0;
  local_5e8._0_4_ = fVar193 + fVar272 + fVar144;
  local_5e8._4_4_ = fVar207 + fVar277 + fVar154;
  fStack_5e0 = fVar208 + fVar278 + fVar155;
  fStack_5dc = fVar209 + fVar279 + fVar156;
  auVar122._0_4_ = fVar222 * 3.0 + fVar144;
  auVar122._4_4_ = fVar232 * 3.0 + fVar154;
  auVar122._8_4_ = fVar233 * 3.0 + fVar155;
  auVar122._12_4_ = fVar234 * 3.0 + fVar156;
  auVar223._0_4_ = fVar193 * 3.0;
  auVar223._4_4_ = fVar207 * 3.0;
  auVar223._8_4_ = fVar208 * 3.0;
  auVar223._12_4_ = fVar209 * 3.0;
  auVar93 = vsubps_avx(auVar122,auVar223);
  fVar144 = auVar10._0_4_;
  fVar154 = auVar10._4_4_;
  fVar155 = auVar10._8_4_;
  fVar156 = auVar10._12_4_;
  fVar284 = auVar12._0_4_ * 0.0;
  fVar288 = auVar12._4_4_ * 0.0;
  fVar289 = auVar12._8_4_ * 0.0;
  fVar290 = auVar12._12_4_ * 0.0;
  fVar222 = fVar144 * 0.0 + fVar284;
  fVar232 = fVar154 * 0.0 + fVar288;
  fVar233 = fVar155 * 0.0 + fVar289;
  fVar234 = fVar156 * 0.0 + fVar290;
  fVar292 = fVar251 * 0.0;
  fVar299 = fVar258 * 0.0;
  fVar300 = fVar259 * 0.0;
  fVar301 = fVar260 * 0.0;
  auVar302._0_4_ = fVar292 + fVar222 + fVar60;
  auVar302._4_4_ = fVar299 + fVar232 + fVar61;
  auVar302._8_4_ = fVar300 + fVar233 + fVar90;
  auVar302._12_4_ = fVar301 + fVar234 + fVar91;
  auVar224._0_4_ = fVar251 * 3.0 + fVar222;
  auVar224._4_4_ = fVar258 * 3.0 + fVar232;
  auVar224._8_4_ = fVar259 * 3.0 + fVar233;
  auVar224._12_4_ = fVar260 * 3.0 + fVar234;
  auVar252._0_4_ = fVar60 * 3.0;
  auVar252._4_4_ = fVar61 * 3.0;
  auVar252._8_4_ = fVar90 * 3.0;
  auVar252._12_4_ = fVar91 * 3.0;
  auVar13 = vsubps_avx(auVar224,auVar252);
  auVar262._0_4_ = fVar193 * 0.0;
  auVar262._4_4_ = fVar207 * 0.0;
  auVar262._8_4_ = fVar208 * 0.0;
  auVar262._12_4_ = fVar209 * 0.0;
  auVar148._0_4_ = auVar262._0_4_ + fVar272 + fVar261 + fVar174;
  auVar148._4_4_ = auVar262._4_4_ + fVar277 + fVar269 + fVar190;
  auVar148._8_4_ = auVar262._8_4_ + fVar278 + fVar270 + fVar191;
  auVar148._12_4_ = auVar262._12_4_ + fVar279 + fVar271 + fVar192;
  auVar159._0_4_ = fVar174 * 3.0;
  auVar159._4_4_ = fVar190 * 3.0;
  auVar159._8_4_ = fVar191 * 3.0;
  auVar159._12_4_ = fVar192 * 3.0;
  auVar225._0_4_ = auVar263._0_4_ * 3.0;
  auVar225._4_4_ = auVar263._4_4_ * 3.0;
  auVar225._8_4_ = auVar263._8_4_ * 3.0;
  auVar225._12_4_ = auVar263._12_4_ * 3.0;
  auVar216 = vsubps_avx(auVar159,auVar225);
  auVar160._0_4_ = fVar272 + auVar216._0_4_;
  auVar160._4_4_ = fVar277 + auVar216._4_4_;
  auVar160._8_4_ = fVar278 + auVar216._8_4_;
  auVar160._12_4_ = fVar279 + auVar216._12_4_;
  auVar118 = vsubps_avx(auVar160,auVar262);
  auVar177._0_4_ = fVar60 * 0.0;
  auVar177._4_4_ = fVar61 * 0.0;
  auVar177._8_4_ = fVar90 * 0.0;
  auVar177._12_4_ = fVar91 * 0.0;
  auVar236._0_4_ = fVar292 + fVar284 + fVar144 + auVar177._0_4_;
  auVar236._4_4_ = fVar299 + fVar288 + fVar154 + auVar177._4_4_;
  auVar236._8_4_ = fVar300 + fVar289 + fVar155 + auVar177._8_4_;
  auVar236._12_4_ = fVar301 + fVar290 + fVar156 + auVar177._12_4_;
  auVar196._0_4_ = fVar144 * 3.0;
  auVar196._4_4_ = fVar154 * 3.0;
  auVar196._8_4_ = fVar155 * 3.0;
  auVar196._12_4_ = fVar156 * 3.0;
  auVar212._0_4_ = auVar12._0_4_ * 3.0;
  auVar212._4_4_ = auVar12._4_4_ * 3.0;
  auVar212._8_4_ = auVar12._8_4_ * 3.0;
  auVar212._12_4_ = auVar12._12_4_ * 3.0;
  auVar216 = vsubps_avx(auVar196,auVar212);
  auVar197._0_4_ = fVar292 + auVar216._0_4_;
  auVar197._4_4_ = fVar299 + auVar216._4_4_;
  auVar197._8_4_ = fVar300 + auVar216._8_4_;
  auVar197._12_4_ = fVar301 + auVar216._12_4_;
  auVar63 = vsubps_avx(auVar197,auVar177);
  auVar216 = vshufps_avx(auVar93,auVar93,0xc9);
  auVar10 = vshufps_avx(auVar302,auVar302,0xc9);
  fVar222 = auVar93._0_4_;
  auVar213._0_4_ = fVar222 * auVar10._0_4_;
  fVar233 = auVar93._4_4_;
  auVar213._4_4_ = fVar233 * auVar10._4_4_;
  fVar251 = auVar93._8_4_;
  auVar213._8_4_ = fVar251 * auVar10._8_4_;
  fVar259 = auVar93._12_4_;
  auVar213._12_4_ = fVar259 * auVar10._12_4_;
  auVar226._0_4_ = auVar302._0_4_ * auVar216._0_4_;
  auVar226._4_4_ = auVar302._4_4_ * auVar216._4_4_;
  auVar226._8_4_ = auVar302._8_4_ * auVar216._8_4_;
  auVar226._12_4_ = auVar302._12_4_ * auVar216._12_4_;
  auVar10 = vsubps_avx(auVar226,auVar213);
  auVar263 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar214._0_4_ = fVar222 * auVar10._0_4_;
  auVar214._4_4_ = fVar233 * auVar10._4_4_;
  auVar214._8_4_ = fVar251 * auVar10._8_4_;
  auVar214._12_4_ = fVar259 * auVar10._12_4_;
  auVar178._0_4_ = auVar13._0_4_ * auVar216._0_4_;
  auVar178._4_4_ = auVar13._4_4_ * auVar216._4_4_;
  auVar178._8_4_ = auVar13._8_4_ * auVar216._8_4_;
  auVar178._12_4_ = auVar13._12_4_ * auVar216._12_4_;
  auVar216 = vsubps_avx(auVar178,auVar214);
  auVar12 = vshufps_avx(auVar216,auVar216,0xc9);
  auVar216 = vshufps_avx(auVar118,auVar118,0xc9);
  auVar10 = vshufps_avx(auVar236,auVar236,0xc9);
  fVar261 = auVar118._0_4_;
  auVar179._0_4_ = fVar261 * auVar10._0_4_;
  fVar269 = auVar118._4_4_;
  auVar179._4_4_ = fVar269 * auVar10._4_4_;
  fVar270 = auVar118._8_4_;
  auVar179._8_4_ = fVar270 * auVar10._8_4_;
  fVar271 = auVar118._12_4_;
  auVar179._12_4_ = fVar271 * auVar10._12_4_;
  auVar237._0_4_ = auVar236._0_4_ * auVar216._0_4_;
  auVar237._4_4_ = auVar236._4_4_ * auVar216._4_4_;
  auVar237._8_4_ = auVar236._8_4_ * auVar216._8_4_;
  auVar237._12_4_ = auVar236._12_4_ * auVar216._12_4_;
  auVar10 = vsubps_avx(auVar237,auVar179);
  auVar13 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar238._0_4_ = auVar10._0_4_ * fVar261;
  auVar238._4_4_ = auVar10._4_4_ * fVar269;
  auVar238._8_4_ = auVar10._8_4_ * fVar270;
  auVar238._12_4_ = auVar10._12_4_ * fVar271;
  auVar198._0_4_ = auVar216._0_4_ * auVar63._0_4_;
  auVar198._4_4_ = auVar216._4_4_ * auVar63._4_4_;
  auVar198._8_4_ = auVar216._8_4_ * auVar63._8_4_;
  auVar198._12_4_ = auVar216._12_4_ * auVar63._12_4_;
  auVar10 = vsubps_avx(auVar198,auVar238);
  auVar216 = vdpps_avx(auVar263,auVar263,0x7f);
  auVar63 = vshufps_avx(auVar10,auVar10,0xc9);
  fVar191 = auVar216._0_4_;
  auVar94 = ZEXT416((uint)fVar191);
  auVar10 = vrsqrtss_avx(auVar94,auVar94);
  fVar174 = auVar10._0_4_;
  auVar10 = vdpps_avx(auVar263,auVar12,0x7f);
  auVar64 = ZEXT416((uint)(fVar174 * 1.5 - fVar191 * 0.5 * fVar174 * fVar174 * fVar174));
  auVar64 = vshufps_avx(auVar64,auVar64,0);
  fVar174 = auVar263._0_4_ * auVar64._0_4_;
  fVar144 = auVar263._4_4_ * auVar64._4_4_;
  fVar190 = auVar263._8_4_ * auVar64._8_4_;
  fVar154 = auVar263._12_4_ * auVar64._12_4_;
  auVar216 = vshufps_avx(auVar216,auVar216,0);
  auVar253._0_4_ = auVar216._0_4_ * auVar12._0_4_;
  auVar253._4_4_ = auVar216._4_4_ * auVar12._4_4_;
  auVar253._8_4_ = auVar216._8_4_ * auVar12._8_4_;
  auVar253._12_4_ = auVar216._12_4_ * auVar12._12_4_;
  auVar216 = vshufps_avx(auVar10,auVar10,0);
  auVar227._0_4_ = auVar216._0_4_ * auVar263._0_4_;
  auVar227._4_4_ = auVar216._4_4_ * auVar263._4_4_;
  auVar227._8_4_ = auVar216._8_4_ * auVar263._8_4_;
  auVar227._12_4_ = auVar216._12_4_ * auVar263._12_4_;
  auVar92 = vsubps_avx(auVar253,auVar227);
  auVar216 = vrcpss_avx(auVar94,auVar94);
  auVar10 = vdpps_avx(auVar13,auVar13,0x7f);
  auVar216 = ZEXT416((uint)(auVar216._0_4_ * (2.0 - fVar191 * auVar216._0_4_)));
  auVar12 = vshufps_avx(auVar216,auVar216,0);
  auVar216 = vblendps_avx(auVar10,_DAT_01f45a50,0xe);
  auVar263 = vrsqrtss_avx(auVar216,auVar216);
  fVar191 = auVar263._0_4_;
  auVar263 = ZEXT416((uint)(fVar191 * 1.5 - auVar10._0_4_ * 0.5 * fVar191 * fVar191 * fVar191));
  auVar94 = vshufps_avx(auVar263,auVar263,0);
  auVar263 = vdpps_avx(auVar13,auVar63,0x7f);
  fVar191 = auVar94._0_4_ * auVar13._0_4_;
  fVar155 = auVar94._4_4_ * auVar13._4_4_;
  fVar192 = auVar94._8_4_ * auVar13._8_4_;
  fVar156 = auVar94._12_4_ * auVar13._12_4_;
  auVar62 = vshufps_avx(auVar10,auVar10,0);
  auVar215._0_4_ = auVar62._0_4_ * auVar63._0_4_;
  auVar215._4_4_ = auVar62._4_4_ * auVar63._4_4_;
  auVar215._8_4_ = auVar62._8_4_ * auVar63._8_4_;
  auVar215._12_4_ = auVar62._12_4_ * auVar63._12_4_;
  auVar263 = vshufps_avx(auVar263,auVar263,0);
  auVar180._0_4_ = auVar263._0_4_ * auVar13._0_4_;
  auVar180._4_4_ = auVar263._4_4_ * auVar13._4_4_;
  auVar180._8_4_ = auVar263._8_4_ * auVar13._8_4_;
  auVar180._12_4_ = auVar263._12_4_ * auVar13._12_4_;
  auVar13 = vsubps_avx(auVar215,auVar180);
  auVar216 = vrcpss_avx(auVar216,auVar216);
  auVar216 = ZEXT416((uint)((2.0 - auVar10._0_4_ * auVar216._0_4_) * auVar216._0_4_));
  auVar216 = vshufps_avx(auVar216,auVar216,0);
  auVar10 = vshufps_avx(_local_5e8,_local_5e8,0xff);
  auVar239._0_4_ = auVar10._0_4_ * fVar174;
  auVar239._4_4_ = auVar10._4_4_ * fVar144;
  auVar239._8_4_ = auVar10._8_4_ * fVar190;
  auVar239._12_4_ = auVar10._12_4_ * fVar154;
  auVar62 = vsubps_avx(_local_5e8,auVar239);
  auVar263 = vshufps_avx(auVar93,auVar93,0xff);
  auVar199._0_4_ =
       auVar263._0_4_ * fVar174 + auVar64._0_4_ * auVar92._0_4_ * auVar12._0_4_ * auVar10._0_4_;
  auVar199._4_4_ =
       auVar263._4_4_ * fVar144 + auVar64._4_4_ * auVar92._4_4_ * auVar12._4_4_ * auVar10._4_4_;
  auVar199._8_4_ =
       auVar263._8_4_ * fVar190 + auVar64._8_4_ * auVar92._8_4_ * auVar12._8_4_ * auVar10._8_4_;
  auVar199._12_4_ =
       auVar263._12_4_ * fVar154 + auVar64._12_4_ * auVar92._12_4_ * auVar12._12_4_ * auVar10._12_4_
  ;
  auVar12 = vsubps_avx(auVar93,auVar199);
  auVar273._0_4_ = auVar239._0_4_ + (float)local_5e8._0_4_;
  auVar273._4_4_ = auVar239._4_4_ + (float)local_5e8._4_4_;
  auVar273._8_4_ = auVar239._8_4_ + fStack_5e0;
  auVar273._12_4_ = auVar239._12_4_ + fStack_5dc;
  auVar10 = vshufps_avx(auVar148,auVar148,0xff);
  auVar123._0_4_ = fVar191 * auVar10._0_4_;
  auVar123._4_4_ = fVar155 * auVar10._4_4_;
  auVar123._8_4_ = fVar192 * auVar10._8_4_;
  auVar123._12_4_ = fVar156 * auVar10._12_4_;
  auVar64 = vsubps_avx(auVar148,auVar123);
  auVar263 = vshufps_avx(auVar118,auVar118,0xff);
  auVar96._0_4_ =
       fVar191 * auVar263._0_4_ + auVar10._0_4_ * auVar94._0_4_ * auVar13._0_4_ * auVar216._0_4_;
  auVar96._4_4_ =
       fVar155 * auVar263._4_4_ + auVar10._4_4_ * auVar94._4_4_ * auVar13._4_4_ * auVar216._4_4_;
  auVar96._8_4_ =
       fVar192 * auVar263._8_4_ + auVar10._8_4_ * auVar94._8_4_ * auVar13._8_4_ * auVar216._8_4_;
  auVar96._12_4_ =
       fVar156 * auVar263._12_4_ +
       auVar10._12_4_ * auVar94._12_4_ * auVar13._12_4_ * auVar216._12_4_;
  auVar13 = vsubps_avx(auVar118,auVar96);
  fVar232 = auVar148._0_4_ + auVar123._0_4_;
  fVar234 = auVar148._4_4_ + auVar123._4_4_;
  fVar258 = auVar148._8_4_ + auVar123._8_4_;
  fVar260 = auVar148._12_4_ + auVar123._12_4_;
  auVar285._0_4_ = auVar62._0_4_ + auVar12._0_4_ * 0.33333334;
  auVar285._4_4_ = auVar62._4_4_ + auVar12._4_4_ * 0.33333334;
  auVar285._8_4_ = auVar62._8_4_ + auVar12._8_4_ * 0.33333334;
  auVar285._12_4_ = auVar62._12_4_ + auVar12._12_4_ * 0.33333334;
  auVar94 = vsubps_avx(auVar62,auVar11);
  auVar10 = vmovsldup_avx(auVar94);
  auVar216 = vmovshdup_avx(auVar94);
  auVar263 = vshufps_avx(auVar94,auVar94,0xaa);
  fVar174 = pre->ray_space[k].vx.field_0.m128[0];
  fVar144 = pre->ray_space[k].vx.field_0.m128[1];
  fVar190 = pre->ray_space[k].vx.field_0.m128[2];
  fVar154 = pre->ray_space[k].vx.field_0.m128[3];
  fVar191 = pre->ray_space[k].vy.field_0.m128[0];
  fVar155 = pre->ray_space[k].vy.field_0.m128[1];
  fVar192 = pre->ray_space[k].vy.field_0.m128[2];
  fVar156 = pre->ray_space[k].vy.field_0.m128[3];
  fVar193 = pre->ray_space[k].vz.field_0.m128[0];
  fVar207 = pre->ray_space[k].vz.field_0.m128[1];
  fVar208 = pre->ray_space[k].vz.field_0.m128[2];
  fVar209 = pre->ray_space[k].vz.field_0.m128[3];
  fVar60 = fVar174 * auVar10._0_4_ + auVar263._0_4_ * fVar193 + fVar191 * auVar216._0_4_;
  fVar90 = fVar144 * auVar10._4_4_ + auVar263._4_4_ * fVar207 + fVar155 * auVar216._4_4_;
  local_5e8._4_4_ = fVar90;
  local_5e8._0_4_ = fVar60;
  fStack_5e0 = fVar190 * auVar10._8_4_ + auVar263._8_4_ * fVar208 + fVar192 * auVar216._8_4_;
  fStack_5dc = fVar154 * auVar10._12_4_ + auVar263._12_4_ * fVar209 + fVar156 * auVar216._12_4_;
  auVar93 = vsubps_avx(auVar285,auVar11);
  auVar263 = vshufps_avx(auVar93,auVar93,0xaa);
  auVar216 = vmovshdup_avx(auVar93);
  auVar10 = vmovsldup_avx(auVar93);
  fVar61 = auVar10._0_4_ * fVar174 + auVar216._0_4_ * fVar191 + fVar193 * auVar263._0_4_;
  fVar91 = auVar10._4_4_ * fVar144 + auVar216._4_4_ * fVar155 + fVar207 * auVar263._4_4_;
  local_598._4_4_ = fVar91;
  local_598._0_4_ = fVar61;
  fStack_590 = auVar10._8_4_ * fVar190 + auVar216._8_4_ * fVar192 + fVar208 * auVar263._8_4_;
  fStack_58c = auVar10._12_4_ * fVar154 + auVar216._12_4_ * fVar156 + fVar209 * auVar263._12_4_;
  auVar181._0_4_ = auVar13._0_4_ * 0.33333334;
  auVar181._4_4_ = auVar13._4_4_ * 0.33333334;
  auVar181._8_4_ = auVar13._8_4_ * 0.33333334;
  auVar181._12_4_ = auVar13._12_4_ * 0.33333334;
  auVar118 = vsubps_avx(auVar64,auVar181);
  auVar92 = vsubps_avx(auVar118,auVar11);
  auVar263 = vshufps_avx(auVar92,auVar92,0xaa);
  auVar216 = vmovshdup_avx(auVar92);
  auVar10 = vmovsldup_avx(auVar92);
  auVar303._0_4_ = auVar10._0_4_ * fVar174 + auVar216._0_4_ * fVar191 + fVar193 * auVar263._0_4_;
  auVar303._4_4_ = auVar10._4_4_ * fVar144 + auVar216._4_4_ * fVar155 + fVar207 * auVar263._4_4_;
  auVar303._8_4_ = auVar10._8_4_ * fVar190 + auVar216._8_4_ * fVar192 + fVar208 * auVar263._8_4_;
  auVar303._12_4_ = auVar10._12_4_ * fVar154 + auVar216._12_4_ * fVar156 + fVar209 * auVar263._12_4_
  ;
  auVar119 = vsubps_avx(auVar64,auVar11);
  auVar263 = vshufps_avx(auVar119,auVar119,0xaa);
  auVar216 = vmovshdup_avx(auVar119);
  auVar10 = vmovsldup_avx(auVar119);
  auVar286._0_4_ = auVar10._0_4_ * fVar174 + auVar216._0_4_ * fVar191 + auVar263._0_4_ * fVar193;
  auVar286._4_4_ = auVar10._4_4_ * fVar144 + auVar216._4_4_ * fVar155 + auVar263._4_4_ * fVar207;
  auVar286._8_4_ = auVar10._8_4_ * fVar190 + auVar216._8_4_ * fVar192 + auVar263._8_4_ * fVar208;
  auVar286._12_4_ = auVar10._12_4_ * fVar154 + auVar216._12_4_ * fVar156 + auVar263._12_4_ * fVar209
  ;
  auVar120 = vsubps_avx(auVar273,auVar11);
  auVar263 = vshufps_avx(auVar120,auVar120,0xaa);
  auVar216 = vmovshdup_avx(auVar120);
  auVar10 = vmovsldup_avx(auVar120);
  auVar274._0_4_ = auVar10._0_4_ * fVar174 + auVar216._0_4_ * fVar191 + auVar263._0_4_ * fVar193;
  auVar274._4_4_ = auVar10._4_4_ * fVar144 + auVar216._4_4_ * fVar155 + auVar263._4_4_ * fVar207;
  auVar274._8_4_ = auVar10._8_4_ * fVar190 + auVar216._8_4_ * fVar192 + auVar263._8_4_ * fVar208;
  auVar274._12_4_ = auVar10._12_4_ * fVar154 + auVar216._12_4_ * fVar156 + auVar263._12_4_ * fVar209
  ;
  auVar65._0_4_ = (fVar222 + auVar199._0_4_) * 0.33333334 + auVar273._0_4_;
  auVar65._4_4_ = (fVar233 + auVar199._4_4_) * 0.33333334 + auVar273._4_4_;
  auVar65._8_4_ = (fVar251 + auVar199._8_4_) * 0.33333334 + auVar273._8_4_;
  auVar65._12_4_ = (fVar259 + auVar199._12_4_) * 0.33333334 + auVar273._12_4_;
  auVar145 = vsubps_avx(auVar65,auVar11);
  auVar263 = vshufps_avx(auVar145,auVar145,0xaa);
  auVar216 = vmovshdup_avx(auVar145);
  auVar10 = vmovsldup_avx(auVar145);
  auVar240._0_4_ = auVar10._0_4_ * fVar174 + auVar216._0_4_ * fVar191 + auVar263._0_4_ * fVar193;
  auVar240._4_4_ = auVar10._4_4_ * fVar144 + auVar216._4_4_ * fVar155 + auVar263._4_4_ * fVar207;
  auVar240._8_4_ = auVar10._8_4_ * fVar190 + auVar216._8_4_ * fVar192 + auVar263._8_4_ * fVar208;
  auVar240._12_4_ = auVar10._12_4_ * fVar154 + auVar216._12_4_ * fVar156 + auVar263._12_4_ * fVar209
  ;
  auVar217._0_4_ = (fVar261 + auVar96._0_4_) * 0.33333334;
  auVar217._4_4_ = (fVar269 + auVar96._4_4_) * 0.33333334;
  auVar217._8_4_ = (fVar270 + auVar96._8_4_) * 0.33333334;
  auVar217._12_4_ = (fVar271 + auVar96._12_4_) * 0.33333334;
  auVar100._4_4_ = fVar234;
  auVar100._0_4_ = fVar232;
  auVar100._8_4_ = fVar258;
  auVar100._12_4_ = fVar260;
  auVar146 = vsubps_avx(auVar100,auVar217);
  auVar157 = vsubps_avx(auVar146,auVar11);
  auVar263 = vshufps_avx(auVar157,auVar157,0xaa);
  auVar216 = vmovshdup_avx(auVar157);
  auVar10 = vmovsldup_avx(auVar157);
  auVar97._0_4_ = auVar10._0_4_ * fVar174 + auVar216._0_4_ * fVar191 + fVar193 * auVar263._0_4_;
  auVar97._4_4_ = auVar10._4_4_ * fVar144 + auVar216._4_4_ * fVar155 + fVar207 * auVar263._4_4_;
  auVar97._8_4_ = auVar10._8_4_ * fVar190 + auVar216._8_4_ * fVar192 + fVar208 * auVar263._8_4_;
  auVar97._12_4_ = auVar10._12_4_ * fVar154 + auVar216._12_4_ * fVar156 + fVar209 * auVar263._12_4_;
  auVar158 = vsubps_avx(auVar100,auVar11);
  auVar263 = vshufps_avx(auVar158,auVar158,0xaa);
  auVar216 = vmovshdup_avx(auVar158);
  auVar10 = vmovsldup_avx(auVar158);
  auVar66._0_4_ = fVar174 * auVar10._0_4_ + fVar191 * auVar216._0_4_ + fVar193 * auVar263._0_4_;
  auVar66._4_4_ = fVar144 * auVar10._4_4_ + fVar155 * auVar216._4_4_ + fVar207 * auVar263._4_4_;
  auVar66._8_4_ = fVar190 * auVar10._8_4_ + fVar192 * auVar216._8_4_ + fVar208 * auVar263._8_4_;
  auVar66._12_4_ = fVar154 * auVar10._12_4_ + fVar156 * auVar216._12_4_ + fVar209 * auVar263._12_4_;
  auVar11 = vmovlhps_avx(_local_5e8,auVar274);
  auVar12 = vmovlhps_avx(_local_598,auVar240);
  auVar13 = vmovlhps_avx(auVar303,auVar97);
  auVar63 = vmovlhps_avx(auVar286,auVar66);
  auVar216 = vminps_avx(auVar11,auVar12);
  auVar10 = vminps_avx(auVar13,auVar63);
  auVar263 = vminps_avx(auVar216,auVar10);
  auVar216 = vmaxps_avx(auVar11,auVar12);
  auVar10 = vmaxps_avx(auVar13,auVar63);
  auVar216 = vmaxps_avx(auVar216,auVar10);
  auVar10 = vshufpd_avx(auVar263,auVar263,3);
  auVar263 = vminps_avx(auVar263,auVar10);
  auVar10 = vshufpd_avx(auVar216,auVar216,3);
  auVar10 = vmaxps_avx(auVar216,auVar10);
  auVar200._8_4_ = 0x7fffffff;
  auVar200._0_8_ = 0x7fffffff7fffffff;
  auVar200._12_4_ = 0x7fffffff;
  auVar216 = vandps_avx(auVar263,auVar200);
  auVar10 = vandps_avx(auVar10,auVar200);
  auVar216 = vmaxps_avx(auVar216,auVar10);
  auVar10 = vmovshdup_avx(auVar216);
  auVar216 = vmaxss_avx(auVar10,auVar216);
  local_470 = uVar54 + 0xf;
  fVar144 = auVar216._0_4_ * 9.536743e-07;
  auVar216 = vshufps_avx(ZEXT416((uint)fVar144),ZEXT416((uint)fVar144),0);
  local_78._16_16_ = auVar216;
  local_78._0_16_ = auVar216;
  auVar67._0_8_ = auVar216._0_8_ ^ 0x8000000080000000;
  auVar67._8_4_ = auVar216._8_4_ ^ 0x80000000;
  auVar67._12_4_ = auVar216._12_4_ ^ 0x80000000;
  local_98._16_16_ = auVar67;
  local_98._0_16_ = auVar67;
  auVar216 = vpshufd_avx(ZEXT416(uVar53),0);
  auVar10 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar55 * 4 + 6)),0);
  uVar59 = 0;
  fVar174 = *(float *)(ray + k * 4 + 0x30);
  auVar263 = vsubps_avx(auVar12,auVar11);
  auVar175 = vsubps_avx(auVar13,auVar12);
  auVar176 = vsubps_avx(auVar63,auVar13);
  auVar194 = vsubps_avx(auVar273,auVar62);
  auVar195 = vsubps_avx(auVar65,auVar285);
  auVar210 = vsubps_avx(auVar146,auVar118);
  auVar127._4_4_ = fVar234;
  auVar127._0_4_ = fVar232;
  auVar127._8_4_ = fVar258;
  auVar127._12_4_ = fVar260;
  auVar211 = vsubps_avx(auVar127,auVar64);
  auVar298 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar305 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_007f961b:
  do {
    auVar123 = auVar305._0_16_;
    auVar122 = auVar298._0_16_;
    auVar71 = vshufps_avx(auVar122,auVar122,0x50);
    auVar293._8_4_ = 0x3f800000;
    auVar293._0_8_ = 0x3f8000003f800000;
    auVar293._12_4_ = 0x3f800000;
    auVar297._16_4_ = 0x3f800000;
    auVar297._0_16_ = auVar293;
    auVar297._20_4_ = 0x3f800000;
    auVar297._24_4_ = 0x3f800000;
    auVar297._28_4_ = 0x3f800000;
    auVar235 = vsubps_avx(auVar293,auVar71);
    fVar190 = auVar71._0_4_;
    fVar154 = auVar71._4_4_;
    fVar191 = auVar71._8_4_;
    fVar155 = auVar71._12_4_;
    fVar192 = auVar235._0_4_;
    fVar156 = auVar235._4_4_;
    fVar193 = auVar235._8_4_;
    fVar207 = auVar235._12_4_;
    auVar149._0_4_ = auVar274._0_4_ * fVar190 + fVar192 * fVar60;
    auVar149._4_4_ = auVar274._4_4_ * fVar154 + fVar156 * fVar90;
    auVar149._8_4_ = auVar274._0_4_ * fVar191 + fVar193 * fVar60;
    auVar149._12_4_ = auVar274._4_4_ * fVar155 + fVar207 * fVar90;
    auVar124._0_4_ = auVar240._0_4_ * fVar190 + fVar192 * fVar61;
    auVar124._4_4_ = auVar240._4_4_ * fVar154 + fVar156 * fVar91;
    auVar124._8_4_ = auVar240._0_4_ * fVar191 + fVar193 * fVar61;
    auVar124._12_4_ = auVar240._4_4_ * fVar155 + fVar207 * fVar91;
    auVar218._0_4_ = auVar97._0_4_ * fVar190 + auVar303._0_4_ * fVar192;
    auVar218._4_4_ = auVar97._4_4_ * fVar154 + auVar303._4_4_ * fVar156;
    auVar218._8_4_ = auVar97._0_4_ * fVar191 + auVar303._0_4_ * fVar193;
    auVar218._12_4_ = auVar97._4_4_ * fVar155 + auVar303._4_4_ * fVar207;
    auVar161._0_4_ = auVar66._0_4_ * fVar190 + auVar286._0_4_ * fVar192;
    auVar161._4_4_ = auVar66._4_4_ * fVar154 + auVar286._4_4_ * fVar156;
    auVar161._8_4_ = auVar66._0_4_ * fVar191 + auVar286._0_4_ * fVar193;
    auVar161._12_4_ = auVar66._4_4_ * fVar155 + auVar286._4_4_ * fVar207;
    auVar71 = vmovshdup_avx(auVar123);
    auVar235 = vshufps_avx(auVar123,auVar123,0);
    auVar244._16_16_ = auVar235;
    auVar244._0_16_ = auVar235;
    auVar141 = vshufps_avx(auVar123,auVar123,0x55);
    auVar85._16_16_ = auVar141;
    auVar85._0_16_ = auVar141;
    auVar84 = vsubps_avx(auVar85,auVar244);
    auVar141 = vshufps_avx(auVar149,auVar149,0);
    auVar111 = vshufps_avx(auVar149,auVar149,0x55);
    auVar100 = vshufps_avx(auVar124,auVar124,0);
    auVar127 = vshufps_avx(auVar124,auVar124,0x55);
    auVar67 = vshufps_avx(auVar218,auVar218,0);
    auVar95 = vshufps_avx(auVar218,auVar218,0x55);
    auVar96 = vshufps_avx(auVar161,auVar161,0);
    auVar121 = vshufps_avx(auVar161,auVar161,0x55);
    auVar71 = ZEXT416((uint)((auVar71._0_4_ - auVar305._0_4_) * 0.04761905));
    auVar71 = vshufps_avx(auVar71,auVar71,0);
    auVar257._0_4_ = auVar235._0_4_ + auVar84._0_4_ * 0.0;
    auVar257._4_4_ = auVar235._4_4_ + auVar84._4_4_ * 0.14285715;
    auVar257._8_4_ = auVar235._8_4_ + auVar84._8_4_ * 0.2857143;
    auVar257._12_4_ = auVar235._12_4_ + auVar84._12_4_ * 0.42857146;
    auVar257._16_4_ = auVar235._0_4_ + auVar84._16_4_ * 0.5714286;
    auVar257._20_4_ = auVar235._4_4_ + auVar84._20_4_ * 0.71428573;
    auVar257._24_4_ = auVar235._8_4_ + auVar84._24_4_ * 0.8571429;
    auVar257._28_4_ = auVar235._12_4_ + auVar84._28_4_;
    auVar14 = vsubps_avx(auVar297,auVar257);
    fVar190 = auVar100._0_4_;
    fVar191 = auVar100._4_4_;
    fVar192 = auVar100._8_4_;
    fVar193 = auVar100._12_4_;
    fVar300 = auVar14._0_4_;
    fVar301 = auVar14._4_4_;
    fVar246 = auVar14._8_4_;
    fVar247 = auVar14._12_4_;
    fVar248 = auVar14._16_4_;
    fVar249 = auVar14._20_4_;
    fVar250 = auVar14._24_4_;
    fVar278 = auVar127._0_4_;
    fVar284 = auVar127._4_4_;
    fVar289 = auVar127._8_4_;
    fVar292 = auVar127._12_4_;
    fVar291 = auVar111._12_4_ + 1.0;
    fVar270 = auVar67._0_4_;
    fVar271 = auVar67._4_4_;
    fVar272 = auVar67._8_4_;
    fVar277 = auVar67._12_4_;
    fVar208 = fVar270 * auVar257._0_4_ + fVar300 * fVar190;
    fVar209 = fVar271 * auVar257._4_4_ + fVar301 * fVar191;
    fVar222 = fVar272 * auVar257._8_4_ + fVar246 * fVar192;
    fVar233 = fVar277 * auVar257._12_4_ + fVar247 * fVar193;
    fVar251 = fVar270 * auVar257._16_4_ + fVar248 * fVar190;
    fVar259 = fVar271 * auVar257._20_4_ + fVar249 * fVar191;
    fVar261 = fVar272 * auVar257._24_4_ + fVar250 * fVar192;
    fVar154 = auVar95._0_4_;
    fVar155 = auVar95._4_4_;
    fVar156 = auVar95._8_4_;
    fVar207 = auVar95._12_4_;
    fVar279 = fVar278 * fVar300 + auVar257._0_4_ * fVar154;
    fVar288 = fVar284 * fVar301 + auVar257._4_4_ * fVar155;
    fVar290 = fVar289 * fVar246 + auVar257._8_4_ * fVar156;
    fVar299 = fVar292 * fVar247 + auVar257._12_4_ * fVar207;
    fVar280 = fVar278 * fVar248 + auVar257._16_4_ * fVar154;
    fVar281 = fVar284 * fVar249 + auVar257._20_4_ * fVar155;
    fVar282 = fVar289 * fVar250 + auVar257._24_4_ * fVar156;
    fVar283 = fVar292 + fVar193;
    auVar235 = vshufps_avx(auVar149,auVar149,0xaa);
    auVar100 = vshufps_avx(auVar149,auVar149,0xff);
    fVar269 = fVar277 + 0.0;
    auVar127 = vshufps_avx(auVar124,auVar124,0xaa);
    auVar67 = vshufps_avx(auVar124,auVar124,0xff);
    auVar172._0_4_ =
         fVar300 * (auVar257._0_4_ * fVar190 + fVar300 * auVar141._0_4_) + auVar257._0_4_ * fVar208;
    auVar172._4_4_ =
         fVar301 * (auVar257._4_4_ * fVar191 + fVar301 * auVar141._4_4_) + auVar257._4_4_ * fVar209;
    auVar172._8_4_ =
         fVar246 * (auVar257._8_4_ * fVar192 + fVar246 * auVar141._8_4_) + auVar257._8_4_ * fVar222;
    auVar172._12_4_ =
         fVar247 * (auVar257._12_4_ * fVar193 + fVar247 * auVar141._12_4_) +
         auVar257._12_4_ * fVar233;
    auVar172._16_4_ =
         fVar248 * (auVar257._16_4_ * fVar190 + fVar248 * auVar141._0_4_) +
         auVar257._16_4_ * fVar251;
    auVar172._20_4_ =
         fVar249 * (auVar257._20_4_ * fVar191 + fVar249 * auVar141._4_4_) +
         auVar257._20_4_ * fVar259;
    auVar172._24_4_ =
         fVar250 * (auVar257._24_4_ * fVar192 + fVar250 * auVar141._8_4_) +
         auVar257._24_4_ * fVar261;
    auVar172._28_4_ = auVar141._12_4_ + 1.0 + fVar207;
    auVar188._0_4_ =
         fVar300 * (fVar278 * auVar257._0_4_ + auVar111._0_4_ * fVar300) + auVar257._0_4_ * fVar279;
    auVar188._4_4_ =
         fVar301 * (fVar284 * auVar257._4_4_ + auVar111._4_4_ * fVar301) + auVar257._4_4_ * fVar288;
    auVar188._8_4_ =
         fVar246 * (fVar289 * auVar257._8_4_ + auVar111._8_4_ * fVar246) + auVar257._8_4_ * fVar290;
    auVar188._12_4_ =
         fVar247 * (fVar292 * auVar257._12_4_ + auVar111._12_4_ * fVar247) +
         auVar257._12_4_ * fVar299;
    auVar188._16_4_ =
         fVar248 * (fVar278 * auVar257._16_4_ + auVar111._0_4_ * fVar248) +
         auVar257._16_4_ * fVar280;
    auVar188._20_4_ =
         fVar249 * (fVar284 * auVar257._20_4_ + auVar111._4_4_ * fVar249) +
         auVar257._20_4_ * fVar281;
    auVar188._24_4_ =
         fVar250 * (fVar289 * auVar257._24_4_ + auVar111._8_4_ * fVar250) +
         auVar257._24_4_ * fVar282;
    auVar188._28_4_ = auVar121._12_4_ + fVar207;
    auVar86._0_4_ =
         fVar300 * fVar208 + auVar257._0_4_ * (fVar270 * fVar300 + auVar96._0_4_ * auVar257._0_4_);
    auVar86._4_4_ =
         fVar301 * fVar209 + auVar257._4_4_ * (fVar271 * fVar301 + auVar96._4_4_ * auVar257._4_4_);
    auVar86._8_4_ =
         fVar246 * fVar222 + auVar257._8_4_ * (fVar272 * fVar246 + auVar96._8_4_ * auVar257._8_4_);
    auVar86._12_4_ =
         fVar247 * fVar233 +
         auVar257._12_4_ * (fVar277 * fVar247 + auVar96._12_4_ * auVar257._12_4_);
    auVar86._16_4_ =
         fVar248 * fVar251 + auVar257._16_4_ * (fVar270 * fVar248 + auVar96._0_4_ * auVar257._16_4_)
    ;
    auVar86._20_4_ =
         fVar249 * fVar259 + auVar257._20_4_ * (fVar271 * fVar249 + auVar96._4_4_ * auVar257._20_4_)
    ;
    auVar86._24_4_ =
         fVar250 * fVar261 + auVar257._24_4_ * (fVar272 * fVar250 + auVar96._8_4_ * auVar257._24_4_)
    ;
    auVar86._28_4_ = fVar193 + 1.0 + fVar269;
    auVar268._0_4_ =
         fVar300 * fVar279 + auVar257._0_4_ * (auVar121._0_4_ * auVar257._0_4_ + fVar300 * fVar154);
    auVar268._4_4_ =
         fVar301 * fVar288 + auVar257._4_4_ * (auVar121._4_4_ * auVar257._4_4_ + fVar301 * fVar155);
    auVar268._8_4_ =
         fVar246 * fVar290 + auVar257._8_4_ * (auVar121._8_4_ * auVar257._8_4_ + fVar246 * fVar156);
    auVar268._12_4_ =
         fVar247 * fVar299 +
         auVar257._12_4_ * (auVar121._12_4_ * auVar257._12_4_ + fVar247 * fVar207);
    auVar268._16_4_ =
         fVar248 * fVar280 +
         auVar257._16_4_ * (auVar121._0_4_ * auVar257._16_4_ + fVar248 * fVar154);
    auVar268._20_4_ =
         fVar249 * fVar281 +
         auVar257._20_4_ * (auVar121._4_4_ * auVar257._20_4_ + fVar249 * fVar155);
    auVar268._24_4_ =
         fVar250 * fVar282 +
         auVar257._24_4_ * (auVar121._8_4_ * auVar257._24_4_ + fVar250 * fVar156);
    auVar268._28_4_ = fVar269 + fVar207 + 0.0;
    local_d8._0_4_ = fVar300 * auVar172._0_4_ + auVar257._0_4_ * auVar86._0_4_;
    local_d8._4_4_ = fVar301 * auVar172._4_4_ + auVar257._4_4_ * auVar86._4_4_;
    local_d8._8_4_ = fVar246 * auVar172._8_4_ + auVar257._8_4_ * auVar86._8_4_;
    local_d8._12_4_ = fVar247 * auVar172._12_4_ + auVar257._12_4_ * auVar86._12_4_;
    local_d8._16_4_ = fVar248 * auVar172._16_4_ + auVar257._16_4_ * auVar86._16_4_;
    local_d8._20_4_ = fVar249 * auVar172._20_4_ + auVar257._20_4_ * auVar86._20_4_;
    local_d8._24_4_ = fVar250 * auVar172._24_4_ + auVar257._24_4_ * auVar86._24_4_;
    local_d8._28_4_ = fVar283 + fVar207 + 0.0;
    auVar153._0_4_ = fVar300 * auVar188._0_4_ + auVar257._0_4_ * auVar268._0_4_;
    auVar153._4_4_ = fVar301 * auVar188._4_4_ + auVar257._4_4_ * auVar268._4_4_;
    auVar153._8_4_ = fVar246 * auVar188._8_4_ + auVar257._8_4_ * auVar268._8_4_;
    auVar153._12_4_ = fVar247 * auVar188._12_4_ + auVar257._12_4_ * auVar268._12_4_;
    auVar153._16_4_ = fVar248 * auVar188._16_4_ + auVar257._16_4_ * auVar268._16_4_;
    auVar153._20_4_ = fVar249 * auVar188._20_4_ + auVar257._20_4_ * auVar268._20_4_;
    auVar153._24_4_ = fVar250 * auVar188._24_4_ + auVar257._24_4_ * auVar268._24_4_;
    auVar153._28_4_ = fVar283 + fVar269;
    auVar15 = vsubps_avx(auVar86,auVar172);
    auVar84 = vsubps_avx(auVar268,auVar188);
    local_4e8 = auVar71._0_4_;
    fStack_4e4 = auVar71._4_4_;
    fStack_4e0 = auVar71._8_4_;
    fStack_4dc = auVar71._12_4_;
    local_118 = local_4e8 * auVar15._0_4_ * 3.0;
    fStack_114 = fStack_4e4 * auVar15._4_4_ * 3.0;
    auVar16._4_4_ = fStack_114;
    auVar16._0_4_ = local_118;
    fStack_110 = fStack_4e0 * auVar15._8_4_ * 3.0;
    auVar16._8_4_ = fStack_110;
    fStack_10c = fStack_4dc * auVar15._12_4_ * 3.0;
    auVar16._12_4_ = fStack_10c;
    fStack_108 = local_4e8 * auVar15._16_4_ * 3.0;
    auVar16._16_4_ = fStack_108;
    fStack_104 = fStack_4e4 * auVar15._20_4_ * 3.0;
    auVar16._20_4_ = fStack_104;
    fStack_100 = fStack_4e0 * auVar15._24_4_ * 3.0;
    auVar16._24_4_ = fStack_100;
    auVar16._28_4_ = auVar15._28_4_;
    local_138 = local_4e8 * auVar84._0_4_ * 3.0;
    fStack_134 = fStack_4e4 * auVar84._4_4_ * 3.0;
    auVar17._4_4_ = fStack_134;
    auVar17._0_4_ = local_138;
    fStack_130 = fStack_4e0 * auVar84._8_4_ * 3.0;
    auVar17._8_4_ = fStack_130;
    fStack_12c = fStack_4dc * auVar84._12_4_ * 3.0;
    auVar17._12_4_ = fStack_12c;
    fStack_128 = local_4e8 * auVar84._16_4_ * 3.0;
    auVar17._16_4_ = fStack_128;
    fStack_124 = fStack_4e4 * auVar84._20_4_ * 3.0;
    auVar17._20_4_ = fStack_124;
    fStack_120 = fStack_4e0 * auVar84._24_4_ * 3.0;
    auVar17._24_4_ = fStack_120;
    auVar17._28_4_ = fVar283;
    auVar16 = vsubps_avx(local_d8,auVar16);
    auVar84 = vperm2f128_avx(auVar16,auVar16,1);
    auVar84 = vshufps_avx(auVar84,auVar16,0x30);
    auVar84 = vshufps_avx(auVar16,auVar84,0x29);
    auVar17 = vsubps_avx(auVar153,auVar17);
    auVar16 = vperm2f128_avx(auVar17,auVar17,1);
    auVar16 = vshufps_avx(auVar16,auVar17,0x30);
    auVar17 = vshufps_avx(auVar17,auVar16,0x29);
    fVar281 = auVar127._0_4_;
    fVar282 = auVar127._4_4_;
    fVar306 = auVar127._8_4_;
    fVar193 = auVar235._12_4_;
    fVar271 = auVar67._0_4_;
    fVar277 = auVar67._4_4_;
    fVar279 = auVar67._8_4_;
    fVar288 = auVar67._12_4_;
    auVar71 = vshufps_avx(auVar218,auVar218,0xaa);
    fVar190 = auVar71._0_4_;
    fVar191 = auVar71._4_4_;
    fVar192 = auVar71._8_4_;
    fVar207 = auVar71._12_4_;
    fVar222 = auVar257._0_4_ * fVar190 + fVar281 * fVar300;
    fVar233 = auVar257._4_4_ * fVar191 + fVar282 * fVar301;
    fVar251 = auVar257._8_4_ * fVar192 + fVar306 * fVar246;
    fVar259 = auVar257._12_4_ * fVar207 + auVar127._12_4_ * fVar247;
    fVar261 = auVar257._16_4_ * fVar190 + fVar281 * fVar248;
    fVar269 = auVar257._20_4_ * fVar191 + fVar282 * fVar249;
    fVar270 = auVar257._24_4_ * fVar192 + fVar306 * fVar250;
    auVar71 = vshufps_avx(auVar218,auVar218,0xff);
    fVar154 = auVar71._0_4_;
    fVar155 = auVar71._4_4_;
    fVar156 = auVar71._8_4_;
    fVar208 = auVar71._12_4_;
    fVar272 = auVar257._0_4_ * fVar154 + fVar271 * fVar300;
    fVar278 = auVar257._4_4_ * fVar155 + fVar277 * fVar301;
    fVar284 = auVar257._8_4_ * fVar156 + fVar279 * fVar246;
    fVar289 = auVar257._12_4_ * fVar208 + fVar288 * fVar247;
    fVar290 = auVar257._16_4_ * fVar154 + fVar271 * fVar248;
    fVar292 = auVar257._20_4_ * fVar155 + fVar277 * fVar249;
    fVar299 = auVar257._24_4_ * fVar156 + fVar279 * fVar250;
    auVar71 = vshufps_avx(auVar161,auVar161,0xaa);
    fVar280 = auVar71._12_4_ + fVar207;
    auVar141 = vshufps_avx(auVar161,auVar161,0xff);
    fVar209 = auVar141._12_4_;
    auVar87._0_4_ =
         fVar300 * (fVar281 * auVar257._0_4_ + fVar300 * auVar235._0_4_) + auVar257._0_4_ * fVar222;
    auVar87._4_4_ =
         fVar301 * (fVar282 * auVar257._4_4_ + fVar301 * auVar235._4_4_) + auVar257._4_4_ * fVar233;
    auVar87._8_4_ =
         fVar246 * (fVar306 * auVar257._8_4_ + fVar246 * auVar235._8_4_) + auVar257._8_4_ * fVar251;
    auVar87._12_4_ =
         fVar247 * (auVar127._12_4_ * auVar257._12_4_ + fVar247 * fVar193) +
         auVar257._12_4_ * fVar259;
    auVar87._16_4_ =
         fVar248 * (fVar281 * auVar257._16_4_ + fVar248 * auVar235._0_4_) +
         auVar257._16_4_ * fVar261;
    auVar87._20_4_ =
         fVar249 * (fVar282 * auVar257._20_4_ + fVar249 * auVar235._4_4_) +
         auVar257._20_4_ * fVar269;
    auVar87._24_4_ =
         fVar250 * (fVar306 * auVar257._24_4_ + fVar250 * auVar235._8_4_) +
         auVar257._24_4_ * fVar270;
    auVar87._28_4_ = auVar17._28_4_ + fVar193 + fVar209;
    auVar114._0_4_ =
         fVar300 * (fVar271 * auVar257._0_4_ + auVar100._0_4_ * fVar300) + auVar257._0_4_ * fVar272;
    auVar114._4_4_ =
         fVar301 * (fVar277 * auVar257._4_4_ + auVar100._4_4_ * fVar301) + auVar257._4_4_ * fVar278;
    auVar114._8_4_ =
         fVar246 * (fVar279 * auVar257._8_4_ + auVar100._8_4_ * fVar246) + auVar257._8_4_ * fVar284;
    auVar114._12_4_ =
         fVar247 * (fVar288 * auVar257._12_4_ + auVar100._12_4_ * fVar247) +
         auVar257._12_4_ * fVar289;
    auVar114._16_4_ =
         fVar248 * (fVar271 * auVar257._16_4_ + auVar100._0_4_ * fVar248) +
         auVar257._16_4_ * fVar290;
    auVar114._20_4_ =
         fVar249 * (fVar277 * auVar257._20_4_ + auVar100._4_4_ * fVar249) +
         auVar257._20_4_ * fVar292;
    auVar114._24_4_ =
         fVar250 * (fVar279 * auVar257._24_4_ + auVar100._8_4_ * fVar250) +
         auVar257._24_4_ * fVar299;
    auVar114._28_4_ = fVar193 + auVar16._28_4_ + fVar209;
    auVar16 = vperm2f128_avx(local_d8,local_d8,1);
    auVar16 = vshufps_avx(auVar16,local_d8,0x30);
    auVar85 = vshufps_avx(local_d8,auVar16,0x29);
    auVar189._0_4_ =
         auVar257._0_4_ * (auVar71._0_4_ * auVar257._0_4_ + fVar300 * fVar190) + fVar300 * fVar222;
    auVar189._4_4_ =
         auVar257._4_4_ * (auVar71._4_4_ * auVar257._4_4_ + fVar301 * fVar191) + fVar301 * fVar233;
    auVar189._8_4_ =
         auVar257._8_4_ * (auVar71._8_4_ * auVar257._8_4_ + fVar246 * fVar192) + fVar246 * fVar251;
    auVar189._12_4_ =
         auVar257._12_4_ * (auVar71._12_4_ * auVar257._12_4_ + fVar247 * fVar207) +
         fVar247 * fVar259;
    auVar189._16_4_ =
         auVar257._16_4_ * (auVar71._0_4_ * auVar257._16_4_ + fVar248 * fVar190) + fVar248 * fVar261
    ;
    auVar189._20_4_ =
         auVar257._20_4_ * (auVar71._4_4_ * auVar257._20_4_ + fVar249 * fVar191) + fVar249 * fVar269
    ;
    auVar189._24_4_ =
         auVar257._24_4_ * (auVar71._8_4_ * auVar257._24_4_ + fVar250 * fVar192) + fVar250 * fVar270
    ;
    auVar189._28_4_ = fVar280 + fVar291 + auVar188._28_4_;
    auVar231._0_4_ =
         fVar300 * fVar272 + auVar257._0_4_ * (auVar257._0_4_ * auVar141._0_4_ + fVar300 * fVar154);
    auVar231._4_4_ =
         fVar301 * fVar278 + auVar257._4_4_ * (auVar257._4_4_ * auVar141._4_4_ + fVar301 * fVar155);
    auVar231._8_4_ =
         fVar246 * fVar284 + auVar257._8_4_ * (auVar257._8_4_ * auVar141._8_4_ + fVar246 * fVar156);
    auVar231._12_4_ =
         fVar247 * fVar289 + auVar257._12_4_ * (auVar257._12_4_ * fVar209 + fVar247 * fVar208);
    auVar231._16_4_ =
         fVar248 * fVar290 +
         auVar257._16_4_ * (auVar257._16_4_ * auVar141._0_4_ + fVar248 * fVar154);
    auVar231._20_4_ =
         fVar249 * fVar292 +
         auVar257._20_4_ * (auVar257._20_4_ * auVar141._4_4_ + fVar249 * fVar155);
    auVar231._24_4_ =
         fVar250 * fVar299 +
         auVar257._24_4_ * (auVar257._24_4_ * auVar141._8_4_ + fVar250 * fVar156);
    auVar231._28_4_ = fVar291 + fVar288 + fVar209 + fVar208;
    auVar221._0_4_ = fVar300 * auVar87._0_4_ + auVar257._0_4_ * auVar189._0_4_;
    auVar221._4_4_ = fVar301 * auVar87._4_4_ + auVar257._4_4_ * auVar189._4_4_;
    auVar221._8_4_ = fVar246 * auVar87._8_4_ + auVar257._8_4_ * auVar189._8_4_;
    auVar221._12_4_ = fVar247 * auVar87._12_4_ + auVar257._12_4_ * auVar189._12_4_;
    auVar221._16_4_ = fVar248 * auVar87._16_4_ + auVar257._16_4_ * auVar189._16_4_;
    auVar221._20_4_ = fVar249 * auVar87._20_4_ + auVar257._20_4_ * auVar189._20_4_;
    auVar221._24_4_ = fVar250 * auVar87._24_4_ + auVar257._24_4_ * auVar189._24_4_;
    auVar221._28_4_ = fVar280 + fVar209 + fVar208;
    auVar245._0_4_ = fVar300 * auVar114._0_4_ + auVar257._0_4_ * auVar231._0_4_;
    auVar245._4_4_ = fVar301 * auVar114._4_4_ + auVar257._4_4_ * auVar231._4_4_;
    auVar245._8_4_ = fVar246 * auVar114._8_4_ + auVar257._8_4_ * auVar231._8_4_;
    auVar245._12_4_ = fVar247 * auVar114._12_4_ + auVar257._12_4_ * auVar231._12_4_;
    auVar245._16_4_ = fVar248 * auVar114._16_4_ + auVar257._16_4_ * auVar231._16_4_;
    auVar245._20_4_ = fVar249 * auVar114._20_4_ + auVar257._20_4_ * auVar231._20_4_;
    auVar245._24_4_ = fVar250 * auVar114._24_4_ + auVar257._24_4_ * auVar231._24_4_;
    auVar245._28_4_ = auVar14._28_4_ + auVar257._28_4_;
    auVar18 = vsubps_avx(auVar189,auVar87);
    auVar16 = vsubps_avx(auVar231,auVar114);
    local_158 = local_4e8 * auVar18._0_4_ * 3.0;
    fStack_154 = fStack_4e4 * auVar18._4_4_ * 3.0;
    auVar14._4_4_ = fStack_154;
    auVar14._0_4_ = local_158;
    fStack_150 = fStack_4e0 * auVar18._8_4_ * 3.0;
    auVar14._8_4_ = fStack_150;
    fStack_14c = fStack_4dc * auVar18._12_4_ * 3.0;
    auVar14._12_4_ = fStack_14c;
    fStack_148 = local_4e8 * auVar18._16_4_ * 3.0;
    auVar14._16_4_ = fStack_148;
    fStack_144 = fStack_4e4 * auVar18._20_4_ * 3.0;
    auVar14._20_4_ = fStack_144;
    fStack_140 = fStack_4e0 * auVar18._24_4_ * 3.0;
    auVar14._24_4_ = fStack_140;
    auVar14._28_4_ = auVar18._28_4_;
    local_178 = local_4e8 * auVar16._0_4_ * 3.0;
    fStack_174 = fStack_4e4 * auVar16._4_4_ * 3.0;
    auVar19._4_4_ = fStack_174;
    auVar19._0_4_ = local_178;
    fStack_170 = fStack_4e0 * auVar16._8_4_ * 3.0;
    auVar19._8_4_ = fStack_170;
    fStack_16c = fStack_4dc * auVar16._12_4_ * 3.0;
    auVar19._12_4_ = fStack_16c;
    fStack_168 = local_4e8 * auVar16._16_4_ * 3.0;
    auVar19._16_4_ = fStack_168;
    fStack_164 = fStack_4e4 * auVar16._20_4_ * 3.0;
    auVar19._20_4_ = fStack_164;
    fStack_160 = fStack_4e0 * auVar16._24_4_ * 3.0;
    auVar19._24_4_ = fStack_160;
    auVar19._28_4_ = auVar189._28_4_;
    auVar16 = vperm2f128_avx(auVar221,auVar221,1);
    auVar16 = vshufps_avx(auVar16,auVar221,0x30);
    auVar86 = vshufps_avx(auVar221,auVar16,0x29);
    auVar14 = vsubps_avx(auVar221,auVar14);
    auVar16 = vperm2f128_avx(auVar14,auVar14,1);
    auVar16 = vshufps_avx(auVar16,auVar14,0x30);
    auVar16 = vshufps_avx(auVar14,auVar16,0x29);
    auVar19 = vsubps_avx(auVar245,auVar19);
    auVar14 = vperm2f128_avx(auVar19,auVar19,1);
    auVar14 = vshufps_avx(auVar14,auVar19,0x30);
    local_b8 = vshufps_avx(auVar19,auVar14,0x29);
    auVar20 = vsubps_avx(auVar221,local_d8);
    auVar87 = vsubps_avx(auVar86,auVar85);
    fVar190 = auVar87._0_4_ + auVar20._0_4_;
    fVar154 = auVar87._4_4_ + auVar20._4_4_;
    fVar191 = auVar87._8_4_ + auVar20._8_4_;
    fVar155 = auVar87._12_4_ + auVar20._12_4_;
    fVar192 = auVar87._16_4_ + auVar20._16_4_;
    fVar156 = auVar87._20_4_ + auVar20._20_4_;
    fVar193 = auVar87._24_4_ + auVar20._24_4_;
    auVar14 = vperm2f128_avx(auVar153,auVar153,1);
    auVar14 = vshufps_avx(auVar14,auVar153,0x30);
    local_f8 = vshufps_avx(auVar153,auVar14,0x29);
    auVar14 = vperm2f128_avx(auVar245,auVar245,1);
    auVar14 = vshufps_avx(auVar14,auVar245,0x30);
    auVar19 = vshufps_avx(auVar245,auVar14,0x29);
    auVar14 = vsubps_avx(auVar245,auVar153);
    auVar114 = vsubps_avx(auVar19,local_f8);
    fVar207 = auVar114._0_4_ + auVar14._0_4_;
    fVar208 = auVar114._4_4_ + auVar14._4_4_;
    fVar209 = auVar114._8_4_ + auVar14._8_4_;
    fVar222 = auVar114._12_4_ + auVar14._12_4_;
    fVar233 = auVar114._16_4_ + auVar14._16_4_;
    fVar251 = auVar114._20_4_ + auVar14._20_4_;
    fVar259 = auVar114._24_4_ + auVar14._24_4_;
    auVar21._4_4_ = fVar154 * auVar153._4_4_;
    auVar21._0_4_ = fVar190 * auVar153._0_4_;
    auVar21._8_4_ = fVar191 * auVar153._8_4_;
    auVar21._12_4_ = fVar155 * auVar153._12_4_;
    auVar21._16_4_ = fVar192 * auVar153._16_4_;
    auVar21._20_4_ = fVar156 * auVar153._20_4_;
    auVar21._24_4_ = fVar193 * auVar153._24_4_;
    auVar21._28_4_ = auVar14._28_4_;
    auVar22._4_4_ = fVar208 * local_d8._4_4_;
    auVar22._0_4_ = fVar207 * local_d8._0_4_;
    auVar22._8_4_ = fVar209 * local_d8._8_4_;
    auVar22._12_4_ = fVar222 * local_d8._12_4_;
    auVar22._16_4_ = fVar233 * local_d8._16_4_;
    auVar22._20_4_ = fVar251 * local_d8._20_4_;
    auVar22._24_4_ = fVar259 * local_d8._24_4_;
    auVar22._28_4_ = fVar280;
    auVar21 = vsubps_avx(auVar21,auVar22);
    local_118 = local_d8._0_4_ + local_118;
    fStack_114 = local_d8._4_4_ + fStack_114;
    fStack_110 = local_d8._8_4_ + fStack_110;
    fStack_10c = local_d8._12_4_ + fStack_10c;
    fStack_108 = local_d8._16_4_ + fStack_108;
    fStack_104 = local_d8._20_4_ + fStack_104;
    fStack_100 = local_d8._24_4_ + fStack_100;
    fStack_fc = local_d8._28_4_ + auVar15._28_4_;
    local_138 = local_138 + auVar153._0_4_;
    fStack_134 = fStack_134 + auVar153._4_4_;
    fStack_130 = fStack_130 + auVar153._8_4_;
    fStack_12c = fStack_12c + auVar153._12_4_;
    fStack_128 = fStack_128 + auVar153._16_4_;
    fStack_124 = fStack_124 + auVar153._20_4_;
    fStack_120 = fStack_120 + auVar153._24_4_;
    fStack_11c = fVar283 + auVar153._28_4_;
    auVar15._4_4_ = fVar154 * fStack_134;
    auVar15._0_4_ = fVar190 * local_138;
    auVar15._8_4_ = fVar191 * fStack_130;
    auVar15._12_4_ = fVar155 * fStack_12c;
    auVar15._16_4_ = fVar192 * fStack_128;
    auVar15._20_4_ = fVar156 * fStack_124;
    auVar15._24_4_ = fVar193 * fStack_120;
    auVar15._28_4_ = fVar283;
    auVar23._4_4_ = fVar208 * fStack_114;
    auVar23._0_4_ = fVar207 * local_118;
    auVar23._8_4_ = fVar209 * fStack_110;
    auVar23._12_4_ = fVar222 * fStack_10c;
    auVar23._16_4_ = fVar233 * fStack_108;
    auVar23._20_4_ = fVar251 * fStack_104;
    auVar23._24_4_ = fVar259 * fStack_100;
    auVar23._28_4_ = fVar283 + auVar153._28_4_;
    auVar15 = vsubps_avx(auVar15,auVar23);
    local_598._0_4_ = auVar17._0_4_;
    local_598._4_4_ = auVar17._4_4_;
    fStack_590 = auVar17._8_4_;
    fStack_58c = auVar17._12_4_;
    fStack_588 = auVar17._16_4_;
    fStack_584 = auVar17._20_4_;
    fStack_580 = auVar17._24_4_;
    auVar24._4_4_ = fVar154 * (float)local_598._4_4_;
    auVar24._0_4_ = fVar190 * (float)local_598._0_4_;
    auVar24._8_4_ = fVar191 * fStack_590;
    auVar24._12_4_ = fVar155 * fStack_58c;
    auVar24._16_4_ = fVar192 * fStack_588;
    auVar24._20_4_ = fVar156 * fStack_584;
    auVar24._24_4_ = fVar193 * fStack_580;
    auVar24._28_4_ = fVar283;
    local_5e8._0_4_ = auVar84._0_4_;
    local_5e8._4_4_ = auVar84._4_4_;
    fStack_5e0 = auVar84._8_4_;
    fStack_5dc = auVar84._12_4_;
    fStack_5d8 = auVar84._16_4_;
    fStack_5d4 = auVar84._20_4_;
    fStack_5d0 = auVar84._24_4_;
    auVar25._4_4_ = fVar208 * (float)local_5e8._4_4_;
    auVar25._0_4_ = fVar207 * (float)local_5e8._0_4_;
    auVar25._8_4_ = fVar209 * fStack_5e0;
    auVar25._12_4_ = fVar222 * fStack_5dc;
    auVar25._16_4_ = fVar233 * fStack_5d8;
    auVar25._20_4_ = fVar251 * fStack_5d4;
    auVar25._24_4_ = fVar259 * fStack_5d0;
    auVar25._28_4_ = local_d8._28_4_;
    auVar22 = vsubps_avx(auVar24,auVar25);
    auVar26._4_4_ = local_f8._4_4_ * fVar154;
    auVar26._0_4_ = local_f8._0_4_ * fVar190;
    auVar26._8_4_ = local_f8._8_4_ * fVar191;
    auVar26._12_4_ = local_f8._12_4_ * fVar155;
    auVar26._16_4_ = local_f8._16_4_ * fVar192;
    auVar26._20_4_ = local_f8._20_4_ * fVar156;
    auVar26._24_4_ = local_f8._24_4_ * fVar193;
    auVar26._28_4_ = fVar283;
    auVar27._4_4_ = auVar85._4_4_ * fVar208;
    auVar27._0_4_ = auVar85._0_4_ * fVar207;
    auVar27._8_4_ = auVar85._8_4_ * fVar209;
    auVar27._12_4_ = auVar85._12_4_ * fVar222;
    auVar27._16_4_ = auVar85._16_4_ * fVar233;
    auVar27._20_4_ = auVar85._20_4_ * fVar251;
    auVar27._24_4_ = auVar85._24_4_ * fVar259;
    auVar27._28_4_ = local_f8._28_4_;
    local_4e8 = auVar16._0_4_;
    fStack_4e4 = auVar16._4_4_;
    fStack_4e0 = auVar16._8_4_;
    fStack_4dc = auVar16._12_4_;
    fStack_4d8 = auVar16._16_4_;
    fStack_4d4 = auVar16._20_4_;
    fStack_4d0 = auVar16._24_4_;
    auVar23 = vsubps_avx(auVar26,auVar27);
    auVar28._4_4_ = auVar245._4_4_ * fVar154;
    auVar28._0_4_ = auVar245._0_4_ * fVar190;
    auVar28._8_4_ = auVar245._8_4_ * fVar191;
    auVar28._12_4_ = auVar245._12_4_ * fVar155;
    auVar28._16_4_ = auVar245._16_4_ * fVar192;
    auVar28._20_4_ = auVar245._20_4_ * fVar156;
    auVar28._24_4_ = auVar245._24_4_ * fVar193;
    auVar28._28_4_ = fVar283;
    auVar29._4_4_ = fVar208 * auVar221._4_4_;
    auVar29._0_4_ = fVar207 * auVar221._0_4_;
    auVar29._8_4_ = fVar209 * auVar221._8_4_;
    auVar29._12_4_ = fVar222 * auVar221._12_4_;
    auVar29._16_4_ = fVar233 * auVar221._16_4_;
    auVar29._20_4_ = fVar251 * auVar221._20_4_;
    auVar29._24_4_ = fVar259 * auVar221._24_4_;
    auVar29._28_4_ = fStack_fc;
    auVar24 = vsubps_avx(auVar28,auVar29);
    local_158 = auVar221._0_4_ + local_158;
    fStack_154 = auVar221._4_4_ + fStack_154;
    fStack_150 = auVar221._8_4_ + fStack_150;
    fStack_14c = auVar221._12_4_ + fStack_14c;
    fStack_148 = auVar221._16_4_ + fStack_148;
    fStack_144 = auVar221._20_4_ + fStack_144;
    fStack_140 = auVar221._24_4_ + fStack_140;
    fStack_13c = auVar221._28_4_ + auVar18._28_4_;
    local_178 = auVar245._0_4_ + local_178;
    fStack_174 = auVar245._4_4_ + fStack_174;
    fStack_170 = auVar245._8_4_ + fStack_170;
    fStack_16c = auVar245._12_4_ + fStack_16c;
    fStack_168 = auVar245._16_4_ + fStack_168;
    fStack_164 = auVar245._20_4_ + fStack_164;
    fStack_160 = auVar245._24_4_ + fStack_160;
    fStack_15c = auVar245._28_4_ + auVar189._28_4_;
    auVar18._4_4_ = fVar154 * fStack_174;
    auVar18._0_4_ = fVar190 * local_178;
    auVar18._8_4_ = fVar191 * fStack_170;
    auVar18._12_4_ = fVar155 * fStack_16c;
    auVar18._16_4_ = fVar192 * fStack_168;
    auVar18._20_4_ = fVar156 * fStack_164;
    auVar18._24_4_ = fVar193 * fStack_160;
    auVar18._28_4_ = auVar245._28_4_ + auVar189._28_4_;
    auVar30._4_4_ = fStack_154 * fVar208;
    auVar30._0_4_ = local_158 * fVar207;
    auVar30._8_4_ = fStack_150 * fVar209;
    auVar30._12_4_ = fStack_14c * fVar222;
    auVar30._16_4_ = fStack_148 * fVar233;
    auVar30._20_4_ = fStack_144 * fVar251;
    auVar30._24_4_ = fStack_140 * fVar259;
    auVar30._28_4_ = fStack_13c;
    auVar18 = vsubps_avx(auVar18,auVar30);
    auVar31._4_4_ = fVar154 * local_b8._4_4_;
    auVar31._0_4_ = fVar190 * local_b8._0_4_;
    auVar31._8_4_ = fVar191 * local_b8._8_4_;
    auVar31._12_4_ = fVar155 * local_b8._12_4_;
    auVar31._16_4_ = fVar192 * local_b8._16_4_;
    auVar31._20_4_ = fVar156 * local_b8._20_4_;
    auVar31._24_4_ = fVar193 * local_b8._24_4_;
    auVar31._28_4_ = fStack_13c;
    auVar32._4_4_ = fVar208 * fStack_4e4;
    auVar32._0_4_ = fVar207 * local_4e8;
    auVar32._8_4_ = fVar209 * fStack_4e0;
    auVar32._12_4_ = fVar222 * fStack_4dc;
    auVar32._16_4_ = fVar233 * fStack_4d8;
    auVar32._20_4_ = fVar251 * fStack_4d4;
    auVar32._24_4_ = fVar259 * fStack_4d0;
    auVar32._28_4_ = local_b8._28_4_;
    auVar25 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = fVar154 * auVar19._4_4_;
    auVar33._0_4_ = fVar190 * auVar19._0_4_;
    auVar33._8_4_ = fVar191 * auVar19._8_4_;
    auVar33._12_4_ = fVar155 * auVar19._12_4_;
    auVar33._16_4_ = fVar192 * auVar19._16_4_;
    auVar33._20_4_ = fVar156 * auVar19._20_4_;
    auVar33._24_4_ = fVar193 * auVar19._24_4_;
    auVar33._28_4_ = auVar87._28_4_ + auVar20._28_4_;
    auVar20._4_4_ = auVar86._4_4_ * fVar208;
    auVar20._0_4_ = auVar86._0_4_ * fVar207;
    auVar20._8_4_ = auVar86._8_4_ * fVar209;
    auVar20._12_4_ = auVar86._12_4_ * fVar222;
    auVar20._16_4_ = auVar86._16_4_ * fVar233;
    auVar20._20_4_ = auVar86._20_4_ * fVar251;
    auVar20._24_4_ = auVar86._24_4_ * fVar259;
    auVar20._28_4_ = auVar114._28_4_ + auVar14._28_4_;
    auVar20 = vsubps_avx(auVar33,auVar20);
    auVar16 = vminps_avx(auVar21,auVar15);
    auVar84 = vmaxps_avx(auVar21,auVar15);
    auVar17 = vminps_avx(auVar22,auVar23);
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(auVar22,auVar23);
    auVar84 = vmaxps_avx(auVar84,auVar16);
    auVar14 = vminps_avx(auVar24,auVar18);
    auVar16 = vmaxps_avx(auVar24,auVar18);
    auVar15 = vminps_avx(auVar25,auVar20);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar15 = vminps_avx(auVar17,auVar15);
    auVar17 = vmaxps_avx(auVar25,auVar20);
    auVar16 = vmaxps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(auVar84,auVar16);
    auVar84 = vcmpps_avx(auVar15,local_78,2);
    auVar16 = vcmpps_avx(auVar16,local_98,5);
    auVar84 = vandps_avx(auVar16,auVar84);
    auVar16 = local_198 & auVar84;
    if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0x7f,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0xbf,0) != '\0') ||
        (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar16[0x1f] < '\0')
    {
      auVar16 = vsubps_avx(auVar85,local_d8);
      auVar17 = vsubps_avx(auVar86,auVar221);
      fVar154 = auVar16._0_4_ + auVar17._0_4_;
      fVar191 = auVar16._4_4_ + auVar17._4_4_;
      fVar155 = auVar16._8_4_ + auVar17._8_4_;
      fVar192 = auVar16._12_4_ + auVar17._12_4_;
      fVar156 = auVar16._16_4_ + auVar17._16_4_;
      fVar193 = auVar16._20_4_ + auVar17._20_4_;
      fVar207 = auVar16._24_4_ + auVar17._24_4_;
      auVar15 = vsubps_avx(local_f8,auVar153);
      auVar18 = vsubps_avx(auVar19,auVar245);
      fVar208 = auVar15._0_4_ + auVar18._0_4_;
      fVar209 = auVar15._4_4_ + auVar18._4_4_;
      fVar222 = auVar15._8_4_ + auVar18._8_4_;
      fVar233 = auVar15._12_4_ + auVar18._12_4_;
      fVar251 = auVar15._16_4_ + auVar18._16_4_;
      fVar259 = auVar15._20_4_ + auVar18._20_4_;
      fVar261 = auVar15._24_4_ + auVar18._24_4_;
      fVar190 = auVar18._28_4_;
      auVar34._4_4_ = auVar153._4_4_ * fVar191;
      auVar34._0_4_ = auVar153._0_4_ * fVar154;
      auVar34._8_4_ = auVar153._8_4_ * fVar155;
      auVar34._12_4_ = auVar153._12_4_ * fVar192;
      auVar34._16_4_ = auVar153._16_4_ * fVar156;
      auVar34._20_4_ = auVar153._20_4_ * fVar193;
      auVar34._24_4_ = auVar153._24_4_ * fVar207;
      auVar34._28_4_ = auVar153._28_4_;
      auVar35._4_4_ = local_d8._4_4_ * fVar209;
      auVar35._0_4_ = local_d8._0_4_ * fVar208;
      auVar35._8_4_ = local_d8._8_4_ * fVar222;
      auVar35._12_4_ = local_d8._12_4_ * fVar233;
      auVar35._16_4_ = local_d8._16_4_ * fVar251;
      auVar35._20_4_ = local_d8._20_4_ * fVar259;
      auVar35._24_4_ = local_d8._24_4_ * fVar261;
      auVar35._28_4_ = local_d8._28_4_;
      auVar18 = vsubps_avx(auVar34,auVar35);
      auVar36._4_4_ = fVar191 * fStack_134;
      auVar36._0_4_ = fVar154 * local_138;
      auVar36._8_4_ = fVar155 * fStack_130;
      auVar36._12_4_ = fVar192 * fStack_12c;
      auVar36._16_4_ = fVar156 * fStack_128;
      auVar36._20_4_ = fVar193 * fStack_124;
      auVar36._24_4_ = fVar207 * fStack_120;
      auVar36._28_4_ = auVar153._28_4_;
      auVar37._4_4_ = fVar209 * fStack_114;
      auVar37._0_4_ = fVar208 * local_118;
      auVar37._8_4_ = fVar222 * fStack_110;
      auVar37._12_4_ = fVar233 * fStack_10c;
      auVar37._16_4_ = fVar251 * fStack_108;
      auVar37._20_4_ = fVar259 * fStack_104;
      auVar37._24_4_ = fVar261 * fStack_100;
      auVar37._28_4_ = fVar190;
      auVar20 = vsubps_avx(auVar36,auVar37);
      auVar38._4_4_ = fVar191 * (float)local_598._4_4_;
      auVar38._0_4_ = fVar154 * (float)local_598._0_4_;
      auVar38._8_4_ = fVar155 * fStack_590;
      auVar38._12_4_ = fVar192 * fStack_58c;
      auVar38._16_4_ = fVar156 * fStack_588;
      auVar38._20_4_ = fVar193 * fStack_584;
      auVar38._24_4_ = fVar207 * fStack_580;
      auVar38._28_4_ = fVar190;
      auVar39._4_4_ = fVar209 * (float)local_5e8._4_4_;
      auVar39._0_4_ = fVar208 * (float)local_5e8._0_4_;
      auVar39._8_4_ = fVar222 * fStack_5e0;
      auVar39._12_4_ = fVar233 * fStack_5dc;
      auVar39._16_4_ = fVar251 * fStack_5d8;
      auVar39._20_4_ = fVar259 * fStack_5d4;
      auVar39._24_4_ = fVar261 * fStack_5d0;
      auVar39._28_4_ = auVar14._28_4_;
      auVar87 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = local_f8._4_4_ * fVar191;
      auVar40._0_4_ = local_f8._0_4_ * fVar154;
      auVar40._8_4_ = local_f8._8_4_ * fVar155;
      auVar40._12_4_ = local_f8._12_4_ * fVar192;
      auVar40._16_4_ = local_f8._16_4_ * fVar156;
      auVar40._20_4_ = local_f8._20_4_ * fVar193;
      auVar40._24_4_ = local_f8._24_4_ * fVar207;
      auVar40._28_4_ = auVar14._28_4_;
      auVar41._4_4_ = auVar85._4_4_ * fVar209;
      auVar41._0_4_ = auVar85._0_4_ * fVar208;
      auVar41._8_4_ = auVar85._8_4_ * fVar222;
      auVar41._12_4_ = auVar85._12_4_ * fVar233;
      auVar41._16_4_ = auVar85._16_4_ * fVar251;
      auVar41._20_4_ = auVar85._20_4_ * fVar259;
      uVar57 = auVar85._28_4_;
      auVar41._24_4_ = auVar85._24_4_ * fVar261;
      auVar41._28_4_ = uVar57;
      auVar85 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = auVar245._4_4_ * fVar191;
      auVar42._0_4_ = auVar245._0_4_ * fVar154;
      auVar42._8_4_ = auVar245._8_4_ * fVar155;
      auVar42._12_4_ = auVar245._12_4_ * fVar192;
      auVar42._16_4_ = auVar245._16_4_ * fVar156;
      auVar42._20_4_ = auVar245._20_4_ * fVar193;
      auVar42._24_4_ = auVar245._24_4_ * fVar207;
      auVar42._28_4_ = uVar57;
      auVar43._4_4_ = auVar221._4_4_ * fVar209;
      auVar43._0_4_ = auVar221._0_4_ * fVar208;
      auVar43._8_4_ = auVar221._8_4_ * fVar222;
      auVar43._12_4_ = auVar221._12_4_ * fVar233;
      auVar43._16_4_ = auVar221._16_4_ * fVar251;
      auVar43._20_4_ = auVar221._20_4_ * fVar259;
      auVar43._24_4_ = auVar221._24_4_ * fVar261;
      auVar43._28_4_ = auVar221._28_4_;
      auVar114 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = fVar191 * fStack_174;
      auVar44._0_4_ = fVar154 * local_178;
      auVar44._8_4_ = fVar155 * fStack_170;
      auVar44._12_4_ = fVar192 * fStack_16c;
      auVar44._16_4_ = fVar156 * fStack_168;
      auVar44._20_4_ = fVar193 * fStack_164;
      auVar44._24_4_ = fVar207 * fStack_160;
      auVar44._28_4_ = uVar57;
      auVar45._4_4_ = fVar209 * fStack_154;
      auVar45._0_4_ = fVar208 * local_158;
      auVar45._8_4_ = fVar222 * fStack_150;
      auVar45._12_4_ = fVar233 * fStack_14c;
      auVar45._16_4_ = fVar251 * fStack_148;
      auVar45._20_4_ = fVar259 * fStack_144;
      auVar45._24_4_ = fVar261 * fStack_140;
      auVar45._28_4_ = auVar245._28_4_;
      auVar21 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar191 * local_b8._4_4_;
      auVar46._0_4_ = fVar154 * local_b8._0_4_;
      auVar46._8_4_ = fVar155 * local_b8._8_4_;
      auVar46._12_4_ = fVar192 * local_b8._12_4_;
      auVar46._16_4_ = fVar156 * local_b8._16_4_;
      auVar46._20_4_ = fVar193 * local_b8._20_4_;
      auVar46._24_4_ = fVar207 * local_b8._24_4_;
      auVar46._28_4_ = auVar245._28_4_;
      auVar47._4_4_ = fStack_4e4 * fVar209;
      auVar47._0_4_ = local_4e8 * fVar208;
      auVar47._8_4_ = fStack_4e0 * fVar222;
      auVar47._12_4_ = fStack_4dc * fVar233;
      auVar47._16_4_ = fStack_4d8 * fVar251;
      auVar47._20_4_ = fStack_4d4 * fVar259;
      auVar47._24_4_ = fStack_4d0 * fVar261;
      auVar47._28_4_ = local_f8._28_4_;
      auVar22 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar191 * auVar19._4_4_;
      auVar48._0_4_ = fVar154 * auVar19._0_4_;
      auVar48._8_4_ = fVar155 * auVar19._8_4_;
      auVar48._12_4_ = fVar192 * auVar19._12_4_;
      auVar48._16_4_ = fVar156 * auVar19._16_4_;
      auVar48._20_4_ = fVar193 * auVar19._20_4_;
      auVar48._24_4_ = fVar207 * auVar19._24_4_;
      auVar48._28_4_ = auVar16._28_4_ + auVar17._28_4_;
      auVar49._4_4_ = auVar86._4_4_ * fVar209;
      auVar49._0_4_ = auVar86._0_4_ * fVar208;
      auVar49._8_4_ = auVar86._8_4_ * fVar222;
      auVar49._12_4_ = auVar86._12_4_ * fVar233;
      auVar49._16_4_ = auVar86._16_4_ * fVar251;
      auVar49._20_4_ = auVar86._20_4_ * fVar259;
      auVar49._24_4_ = auVar86._24_4_ * fVar261;
      auVar49._28_4_ = auVar15._28_4_ + fVar190;
      auVar86 = vsubps_avx(auVar48,auVar49);
      auVar17 = vminps_avx(auVar18,auVar20);
      auVar16 = vmaxps_avx(auVar18,auVar20);
      auVar14 = vminps_avx(auVar87,auVar85);
      auVar14 = vminps_avx(auVar17,auVar14);
      auVar17 = vmaxps_avx(auVar87,auVar85);
      auVar16 = vmaxps_avx(auVar16,auVar17);
      auVar15 = vminps_avx(auVar114,auVar21);
      auVar17 = vmaxps_avx(auVar114,auVar21);
      auVar85 = vminps_avx(auVar22,auVar86);
      auVar15 = vminps_avx(auVar15,auVar85);
      auVar15 = vminps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(auVar22,auVar86);
      auVar17 = vmaxps_avx(auVar17,auVar14);
      auVar17 = vmaxps_avx(auVar16,auVar17);
      auVar16 = vcmpps_avx(auVar15,local_78,2);
      auVar17 = vcmpps_avx(auVar17,local_98,5);
      auVar16 = vandps_avx(auVar17,auVar16);
      auVar84 = vandps_avx(local_198,auVar84);
      auVar17 = auVar84 & auVar16;
      if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar17 >> 0x7f,0) != '\0') ||
            (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0xbf,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar17[0x1f] < '\0') {
        auVar84 = vandps_avx(auVar16,auVar84);
        uVar52 = vmovmskps_avx(auVar84);
        if (uVar52 != 0) {
          mask_stack[uVar59] = uVar52 & 0xff;
          BVar4 = (BBox1f)vmovlps_avx(auVar123);
          cu_stack[uVar59] = BVar4;
          BVar4 = (BBox1f)vmovlps_avx(auVar122);
          cv_stack[uVar59] = BVar4;
          uVar59 = uVar59 + 1;
        }
      }
    }
LAB_007f9c6c:
    do {
      do {
        do {
          do {
            if (uVar59 == 0) {
              uVar57 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar83._4_4_ = uVar57;
              auVar83._0_4_ = uVar57;
              auVar83._8_4_ = uVar57;
              auVar83._12_4_ = uVar57;
              auVar216 = vcmpps_avx(auVar147,auVar83,2);
              uVar53 = vmovmskps_avx(auVar216);
              uVar54 = (ulong)((uint)uVar54 & (uint)local_470 & uVar53);
              goto LAB_007f8e45;
            }
            uVar52 = uVar59 - 1;
            uVar58 = mask_stack[uVar52];
            fVar190 = cu_stack[uVar52].lower;
            fVar154 = cu_stack[uVar52].upper;
            auVar294._8_8_ = 0;
            auVar294._0_4_ = cv_stack[uVar52].lower;
            auVar294._4_4_ = cv_stack[uVar52].upper;
            auVar298 = ZEXT1664(auVar294);
            uVar56 = 0;
            if (uVar58 != 0) {
              for (; (uVar58 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
              }
            }
            uVar58 = uVar58 - 1 & uVar58;
            mask_stack[uVar52] = uVar58;
            if (uVar58 == 0) {
              uVar59 = uVar52;
            }
            fVar155 = (float)(uVar56 + 1) * 0.14285715;
            fVar191 = (1.0 - (float)uVar56 * 0.14285715) * fVar190 +
                      fVar154 * (float)uVar56 * 0.14285715;
            fVar190 = (1.0 - fVar155) * fVar190 + fVar154 * fVar155;
            fVar154 = fVar190 - fVar191;
            if (0.16666667 <= fVar154) {
              auVar71 = vinsertps_avx(ZEXT416((uint)fVar191),ZEXT416((uint)fVar190),0x10);
              auVar305 = ZEXT1664(auVar71);
              goto LAB_007f961b;
            }
            auVar71 = vshufps_avx(auVar294,auVar294,0x50);
            auVar98._8_4_ = 0x3f800000;
            auVar98._0_8_ = 0x3f8000003f800000;
            auVar98._12_4_ = 0x3f800000;
            auVar235 = vsubps_avx(auVar98,auVar71);
            fVar155 = auVar71._0_4_;
            fVar192 = auVar71._4_4_;
            fVar156 = auVar71._8_4_;
            fVar193 = auVar71._12_4_;
            fVar207 = auVar235._0_4_;
            fVar208 = auVar235._4_4_;
            fVar209 = auVar235._8_4_;
            fVar222 = auVar235._12_4_;
            auVar125._0_4_ = auVar274._0_4_ * fVar155 + fVar207 * fVar60;
            auVar125._4_4_ = auVar274._4_4_ * fVar192 + fVar208 * fVar90;
            auVar125._8_4_ = auVar274._0_4_ * fVar156 + fVar209 * fVar60;
            auVar125._12_4_ = auVar274._4_4_ * fVar193 + fVar222 * fVar90;
            auVar162._0_4_ = auVar240._0_4_ * fVar155 + fVar207 * fVar61;
            auVar162._4_4_ = auVar240._4_4_ * fVar192 + fVar208 * fVar91;
            auVar162._8_4_ = auVar240._0_4_ * fVar156 + fVar209 * fVar61;
            auVar162._12_4_ = auVar240._4_4_ * fVar193 + fVar222 * fVar91;
            auVar182._0_4_ = auVar97._0_4_ * fVar155 + auVar303._0_4_ * fVar207;
            auVar182._4_4_ = auVar97._4_4_ * fVar192 + auVar303._4_4_ * fVar208;
            auVar182._8_4_ = auVar97._0_4_ * fVar156 + auVar303._0_4_ * fVar209;
            auVar182._12_4_ = auVar97._4_4_ * fVar193 + auVar303._4_4_ * fVar222;
            auVar68._0_4_ = auVar66._0_4_ * fVar155 + auVar286._0_4_ * fVar207;
            auVar68._4_4_ = auVar66._4_4_ * fVar192 + auVar286._4_4_ * fVar208;
            auVar68._8_4_ = auVar66._0_4_ * fVar156 + auVar286._0_4_ * fVar209;
            auVar68._12_4_ = auVar66._4_4_ * fVar193 + auVar286._4_4_ * fVar222;
            auVar115._16_16_ = auVar125;
            auVar115._0_16_ = auVar125;
            auVar142._16_16_ = auVar162;
            auVar142._0_16_ = auVar162;
            auVar173._16_16_ = auVar182;
            auVar173._0_16_ = auVar182;
            auVar84 = ZEXT2032(CONCAT416(fVar190,ZEXT416((uint)fVar191)));
            auVar84 = vshufps_avx(auVar84,auVar84,0);
            auVar16 = vsubps_avx(auVar142,auVar115);
            fVar155 = auVar84._0_4_;
            fVar192 = auVar84._4_4_;
            fVar156 = auVar84._8_4_;
            fVar193 = auVar84._12_4_;
            fVar207 = auVar84._16_4_;
            fVar208 = auVar84._20_4_;
            fVar209 = auVar84._24_4_;
            auVar116._0_4_ = auVar125._0_4_ + auVar16._0_4_ * fVar155;
            auVar116._4_4_ = auVar125._4_4_ + auVar16._4_4_ * fVar192;
            auVar116._8_4_ = auVar125._8_4_ + auVar16._8_4_ * fVar156;
            auVar116._12_4_ = auVar125._12_4_ + auVar16._12_4_ * fVar193;
            auVar116._16_4_ = auVar125._0_4_ + auVar16._16_4_ * fVar207;
            auVar116._20_4_ = auVar125._4_4_ + auVar16._20_4_ * fVar208;
            auVar116._24_4_ = auVar125._8_4_ + auVar16._24_4_ * fVar209;
            auVar116._28_4_ = auVar125._12_4_ + auVar16._28_4_;
            auVar84 = vsubps_avx(auVar173,auVar142);
            auVar143._0_4_ = auVar162._0_4_ + auVar84._0_4_ * fVar155;
            auVar143._4_4_ = auVar162._4_4_ + auVar84._4_4_ * fVar192;
            auVar143._8_4_ = auVar162._8_4_ + auVar84._8_4_ * fVar156;
            auVar143._12_4_ = auVar162._12_4_ + auVar84._12_4_ * fVar193;
            auVar143._16_4_ = auVar162._0_4_ + auVar84._16_4_ * fVar207;
            auVar143._20_4_ = auVar162._4_4_ + auVar84._20_4_ * fVar208;
            auVar143._24_4_ = auVar162._8_4_ + auVar84._24_4_ * fVar209;
            auVar143._28_4_ = auVar162._12_4_ + auVar84._28_4_;
            auVar71 = vsubps_avx(auVar68,auVar182);
            auVar88._0_4_ = auVar182._0_4_ + auVar71._0_4_ * fVar155;
            auVar88._4_4_ = auVar182._4_4_ + auVar71._4_4_ * fVar192;
            auVar88._8_4_ = auVar182._8_4_ + auVar71._8_4_ * fVar156;
            auVar88._12_4_ = auVar182._12_4_ + auVar71._12_4_ * fVar193;
            auVar88._16_4_ = auVar182._0_4_ + auVar71._0_4_ * fVar207;
            auVar88._20_4_ = auVar182._4_4_ + auVar71._4_4_ * fVar208;
            auVar88._24_4_ = auVar182._8_4_ + auVar71._8_4_ * fVar209;
            auVar88._28_4_ = auVar182._12_4_ + auVar71._12_4_;
            auVar84 = vsubps_avx(auVar143,auVar116);
            auVar117._0_4_ = auVar116._0_4_ + fVar155 * auVar84._0_4_;
            auVar117._4_4_ = auVar116._4_4_ + fVar192 * auVar84._4_4_;
            auVar117._8_4_ = auVar116._8_4_ + fVar156 * auVar84._8_4_;
            auVar117._12_4_ = auVar116._12_4_ + fVar193 * auVar84._12_4_;
            auVar117._16_4_ = auVar116._16_4_ + fVar207 * auVar84._16_4_;
            auVar117._20_4_ = auVar116._20_4_ + fVar208 * auVar84._20_4_;
            auVar117._24_4_ = auVar116._24_4_ + fVar209 * auVar84._24_4_;
            auVar117._28_4_ = auVar116._28_4_ + auVar84._28_4_;
            auVar84 = vsubps_avx(auVar88,auVar143);
            auVar89._0_4_ = auVar143._0_4_ + fVar155 * auVar84._0_4_;
            auVar89._4_4_ = auVar143._4_4_ + fVar192 * auVar84._4_4_;
            auVar89._8_4_ = auVar143._8_4_ + fVar156 * auVar84._8_4_;
            auVar89._12_4_ = auVar143._12_4_ + fVar193 * auVar84._12_4_;
            auVar89._16_4_ = auVar143._16_4_ + fVar207 * auVar84._16_4_;
            auVar89._20_4_ = auVar143._20_4_ + fVar208 * auVar84._20_4_;
            auVar89._24_4_ = auVar143._24_4_ + fVar209 * auVar84._24_4_;
            auVar89._28_4_ = auVar143._28_4_ + auVar84._28_4_;
            auVar84 = vsubps_avx(auVar89,auVar117);
            auVar201._0_4_ = auVar117._0_4_ + fVar155 * auVar84._0_4_;
            auVar201._4_4_ = auVar117._4_4_ + fVar192 * auVar84._4_4_;
            auVar201._8_4_ = auVar117._8_4_ + fVar156 * auVar84._8_4_;
            auVar201._12_4_ = auVar117._12_4_ + fVar193 * auVar84._12_4_;
            auVar206._16_4_ = auVar117._16_4_ + fVar207 * auVar84._16_4_;
            auVar206._0_16_ = auVar201;
            auVar206._20_4_ = auVar117._20_4_ + fVar208 * auVar84._20_4_;
            auVar206._24_4_ = auVar117._24_4_ + fVar209 * auVar84._24_4_;
            auVar206._28_4_ = auVar117._28_4_ + auVar143._28_4_;
            auVar95 = auVar206._16_16_;
            auVar100 = vshufps_avx(ZEXT416((uint)(fVar154 * 0.33333334)),
                                   ZEXT416((uint)(fVar154 * 0.33333334)),0);
            auVar163._0_4_ = auVar201._0_4_ + auVar100._0_4_ * auVar84._0_4_ * 3.0;
            auVar163._4_4_ = auVar201._4_4_ + auVar100._4_4_ * auVar84._4_4_ * 3.0;
            auVar163._8_4_ = auVar201._8_4_ + auVar100._8_4_ * auVar84._8_4_ * 3.0;
            auVar163._12_4_ = auVar201._12_4_ + auVar100._12_4_ * auVar84._12_4_ * 3.0;
            auVar141 = vshufpd_avx(auVar201,auVar201,3);
            auVar111 = vshufpd_avx(auVar95,auVar95,3);
            auVar71 = vsubps_avx(auVar141,auVar201);
            auVar235 = vsubps_avx(auVar111,auVar95);
            auVar69._0_4_ = auVar71._0_4_ + auVar235._0_4_;
            auVar69._4_4_ = auVar71._4_4_ + auVar235._4_4_;
            auVar69._8_4_ = auVar71._8_4_ + auVar235._8_4_;
            auVar69._12_4_ = auVar71._12_4_ + auVar235._12_4_;
            auVar71 = vmovshdup_avx(auVar201);
            auVar235 = vmovshdup_avx(auVar163);
            auVar127 = vshufps_avx(auVar69,auVar69,0);
            auVar67 = vshufps_avx(auVar69,auVar69,0x55);
            fVar155 = auVar67._0_4_;
            fVar192 = auVar67._4_4_;
            fVar156 = auVar67._8_4_;
            fVar193 = auVar67._12_4_;
            fVar207 = auVar127._0_4_;
            fVar208 = auVar127._4_4_;
            fVar209 = auVar127._8_4_;
            fVar222 = auVar127._12_4_;
            auVar70._0_4_ = fVar207 * auVar201._0_4_ + auVar71._0_4_ * fVar155;
            auVar70._4_4_ = fVar208 * auVar201._4_4_ + auVar71._4_4_ * fVar192;
            auVar70._8_4_ = fVar209 * auVar201._8_4_ + auVar71._8_4_ * fVar156;
            auVar70._12_4_ = fVar222 * auVar201._12_4_ + auVar71._12_4_ * fVar193;
            auVar264._0_4_ = fVar207 * auVar163._0_4_ + auVar235._0_4_ * fVar155;
            auVar264._4_4_ = fVar208 * auVar163._4_4_ + auVar235._4_4_ * fVar192;
            auVar264._8_4_ = fVar209 * auVar163._8_4_ + auVar235._8_4_ * fVar156;
            auVar264._12_4_ = fVar222 * auVar163._12_4_ + auVar235._12_4_ * fVar193;
            auVar235 = vshufps_avx(auVar70,auVar70,0xe8);
            auVar127 = vshufps_avx(auVar264,auVar264,0xe8);
            auVar71 = vcmpps_avx(auVar235,auVar127,1);
            uVar52 = vextractps_avx(auVar71,0);
            auVar67 = auVar264;
            if ((uVar52 & 1) == 0) {
              auVar67 = auVar70;
            }
            auVar99._0_4_ = auVar100._0_4_ * auVar84._16_4_ * 3.0;
            auVar99._4_4_ = auVar100._4_4_ * auVar84._20_4_ * 3.0;
            auVar99._8_4_ = auVar100._8_4_ * auVar84._24_4_ * 3.0;
            auVar99._12_4_ = auVar100._12_4_ * 0.0;
            auVar121 = vsubps_avx(auVar95,auVar99);
            auVar100 = vmovshdup_avx(auVar121);
            auVar95 = vmovshdup_avx(auVar95);
            fVar233 = auVar121._0_4_;
            fVar251 = auVar121._4_4_;
            auVar183._0_4_ = fVar233 * fVar207 + auVar100._0_4_ * fVar155;
            auVar183._4_4_ = fVar251 * fVar208 + auVar100._4_4_ * fVar192;
            auVar183._8_4_ = auVar121._8_4_ * fVar209 + auVar100._8_4_ * fVar156;
            auVar183._12_4_ = auVar121._12_4_ * fVar222 + auVar100._12_4_ * fVar193;
            auVar304._0_4_ = fVar207 * auVar206._16_4_ + auVar95._0_4_ * fVar155;
            auVar304._4_4_ = fVar208 * auVar206._20_4_ + auVar95._4_4_ * fVar192;
            auVar304._8_4_ = fVar209 * auVar206._24_4_ + auVar95._8_4_ * fVar156;
            auVar304._12_4_ = fVar222 * auVar206._28_4_ + auVar95._12_4_ * fVar193;
            auVar95 = vshufps_avx(auVar183,auVar183,0xe8);
            auVar96 = vshufps_avx(auVar304,auVar304,0xe8);
            auVar100 = vcmpps_avx(auVar95,auVar96,1);
            uVar52 = vextractps_avx(auVar100,0);
            auVar122 = auVar304;
            if ((uVar52 & 1) == 0) {
              auVar122 = auVar183;
            }
            auVar67 = vmaxss_avx(auVar122,auVar67);
            auVar235 = vminps_avx(auVar235,auVar127);
            auVar127 = vminps_avx(auVar95,auVar96);
            auVar127 = vminps_avx(auVar235,auVar127);
            auVar71 = vshufps_avx(auVar71,auVar71,0x55);
            auVar71 = vblendps_avx(auVar71,auVar100,2);
            auVar100 = vpslld_avx(auVar71,0x1f);
            auVar71 = vshufpd_avx(auVar264,auVar264,1);
            auVar71 = vinsertps_avx(auVar71,auVar304,0x9c);
            auVar235 = vshufpd_avx(auVar70,auVar70,1);
            auVar235 = vinsertps_avx(auVar235,auVar183,0x9c);
            auVar71 = vblendvps_avx(auVar235,auVar71,auVar100);
            auVar235 = vmovshdup_avx(auVar71);
            auVar71 = vmaxss_avx(auVar235,auVar71);
            fVar156 = auVar127._0_4_;
            auVar235 = vmovshdup_avx(auVar127);
            fVar192 = auVar71._0_4_;
            fVar193 = auVar235._0_4_;
            fVar155 = auVar67._0_4_;
            if ((fVar156 < 0.0001) && (-0.0001 < fVar192)) break;
            if ((fVar193 < 0.0001 && -0.0001 < fVar155) || (fVar156 < 0.0001 && -0.0001 < fVar155))
            break;
            auVar100 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar71,1);
            auVar235 = vcmpps_avx(auVar235,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar235 = vandps_avx(auVar235,auVar100);
          } while ((auVar235 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar100 = vcmpps_avx(auVar127,_DAT_01f45a50,1);
          auVar235 = vcmpss_avx(auVar67,ZEXT416(0) << 0x20,1);
          auVar126._8_4_ = 0x3f800000;
          auVar126._0_8_ = 0x3f8000003f800000;
          auVar126._12_4_ = 0x3f800000;
          auVar164._8_4_ = 0xbf800000;
          auVar164._0_8_ = 0xbf800000bf800000;
          auVar164._12_4_ = 0xbf800000;
          auVar235 = vblendvps_avx(auVar126,auVar164,auVar235);
          auVar100 = vblendvps_avx(auVar126,auVar164,auVar100);
          auVar127 = vcmpss_avx(auVar100,auVar235,4);
          auVar127 = vpshufd_avx(ZEXT416(auVar127._0_4_ & 1),0x50);
          auVar127 = vpslld_avx(auVar127,0x1f);
          auVar127 = vpsrad_avx(auVar127,0x1f);
          auVar127 = vpandn_avx(auVar127,_DAT_01f7afb0);
          auVar67 = vmovshdup_avx(auVar100);
          fVar207 = auVar67._0_4_;
          if ((auVar100._0_4_ != fVar207) || (NAN(auVar100._0_4_) || NAN(fVar207))) {
            if ((fVar193 != fVar156) || (NAN(fVar193) || NAN(fVar156))) {
              fVar156 = -fVar156 / (fVar193 - fVar156);
              auVar100 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar156) * 0.0 + fVar156)));
            }
            else {
              auVar100 = ZEXT816(0x3f80000000000000);
              if ((fVar156 != 0.0) || (NAN(fVar156))) {
                auVar100 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar95 = vcmpps_avx(auVar127,auVar100,1);
            auVar67 = vblendps_avx(auVar127,auVar100,2);
            auVar100 = vblendps_avx(auVar100,auVar127,2);
            auVar127 = vblendvps_avx(auVar100,auVar67,auVar95);
          }
          auVar71 = vcmpss_avx(auVar71,ZEXT416(0) << 0x20,1);
          auVar128._8_4_ = 0x3f800000;
          auVar128._0_8_ = 0x3f8000003f800000;
          auVar128._12_4_ = 0x3f800000;
          auVar165._8_4_ = 0xbf800000;
          auVar165._0_8_ = 0xbf800000bf800000;
          auVar165._12_4_ = 0xbf800000;
          auVar71 = vblendvps_avx(auVar128,auVar165,auVar71);
          fVar156 = auVar71._0_4_;
          if ((auVar235._0_4_ != fVar156) || (NAN(auVar235._0_4_) || NAN(fVar156))) {
            if ((fVar192 != fVar155) || (NAN(fVar192) || NAN(fVar155))) {
              fVar155 = -fVar155 / (fVar192 - fVar155);
              auVar71 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar155) * 0.0 + fVar155)));
            }
            else {
              auVar71 = ZEXT816(0x3f80000000000000);
              if ((fVar155 != 0.0) || (NAN(fVar155))) {
                auVar71 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar100 = vcmpps_avx(auVar127,auVar71,1);
            auVar235 = vblendps_avx(auVar127,auVar71,2);
            auVar71 = vblendps_avx(auVar71,auVar127,2);
            auVar127 = vblendvps_avx(auVar71,auVar235,auVar100);
          }
          if ((fVar207 != fVar156) || (NAN(fVar207) || NAN(fVar156))) {
            auVar72._8_4_ = 0x3f800000;
            auVar72._0_8_ = 0x3f8000003f800000;
            auVar72._12_4_ = 0x3f800000;
            auVar71 = vcmpps_avx(auVar127,auVar72,1);
            auVar235 = vinsertps_avx(auVar127,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar129._4_12_ = auVar127._4_12_;
            auVar129._0_4_ = 0x3f800000;
            auVar127 = vblendvps_avx(auVar129,auVar235,auVar71);
          }
          auVar71 = vcmpps_avx(auVar127,_DAT_01f46740,1);
          auVar51._12_4_ = 0;
          auVar51._0_12_ = auVar127._4_12_;
          auVar235 = vinsertps_avx(auVar127,ZEXT416(0x3f800000),0x10);
          auVar71 = vblendvps_avx(auVar235,auVar51 << 0x20,auVar71);
          auVar235 = vmovshdup_avx(auVar71);
        } while (auVar235._0_4_ < auVar71._0_4_);
        auVar73._0_4_ = auVar71._0_4_ + -0.1;
        auVar73._4_4_ = auVar71._4_4_ + 0.1;
        auVar73._8_4_ = auVar71._8_4_ + 0.0;
        auVar73._12_4_ = auVar71._12_4_ + 0.0;
        auVar100 = vshufpd_avx(auVar163,auVar163,3);
        auVar202._8_8_ = 0x3f80000000000000;
        auVar202._0_8_ = 0x3f80000000000000;
        auVar71 = vcmpps_avx(auVar73,auVar202,1);
        auVar50._12_4_ = 0;
        auVar50._0_12_ = auVar73._4_12_;
        auVar235 = vinsertps_avx(auVar73,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar71 = vblendvps_avx(auVar235,auVar50 << 0x20,auVar71);
        auVar235 = vshufpd_avx(auVar121,auVar121,3);
        auVar127 = vshufps_avx(auVar71,auVar71,0x50);
        auVar203._8_4_ = 0x3f800000;
        auVar203._0_8_ = 0x3f8000003f800000;
        auVar203._12_4_ = 0x3f800000;
        auVar67 = vsubps_avx(auVar203,auVar127);
        local_3d8 = auVar141._0_4_;
        fStack_3d4 = auVar141._4_4_;
        fStack_3d0 = auVar141._8_4_;
        fStack_3cc = auVar141._12_4_;
        fVar155 = auVar127._0_4_;
        fVar192 = auVar127._4_4_;
        fVar156 = auVar127._8_4_;
        fVar193 = auVar127._12_4_;
        local_5b8 = auVar111._0_4_;
        fStack_5b4 = auVar111._4_4_;
        fStack_5b0 = auVar111._8_4_;
        fStack_5ac = auVar111._12_4_;
        fVar207 = auVar67._0_4_;
        fVar208 = auVar67._4_4_;
        fVar209 = auVar67._8_4_;
        fVar222 = auVar67._12_4_;
        auVar74._0_4_ = fVar155 * local_3d8 + fVar207 * auVar201._0_4_;
        auVar74._4_4_ = fVar192 * fStack_3d4 + fVar208 * auVar201._4_4_;
        auVar74._8_4_ = fVar156 * fStack_3d0 + fVar209 * auVar201._0_4_;
        auVar74._12_4_ = fVar193 * fStack_3cc + fVar222 * auVar201._4_4_;
        auVar184._0_4_ = auVar100._0_4_ * fVar155 + fVar207 * auVar163._0_4_;
        auVar184._4_4_ = auVar100._4_4_ * fVar192 + fVar208 * auVar163._4_4_;
        auVar184._8_4_ = auVar100._8_4_ * fVar156 + fVar209 * auVar163._0_4_;
        auVar184._12_4_ = auVar100._12_4_ * fVar193 + fVar222 * auVar163._4_4_;
        auVar219._0_4_ = auVar235._0_4_ * fVar155 + fVar207 * fVar233;
        auVar219._4_4_ = auVar235._4_4_ * fVar192 + fVar208 * fVar251;
        auVar219._8_4_ = auVar235._8_4_ * fVar156 + fVar209 * fVar233;
        auVar219._12_4_ = auVar235._12_4_ * fVar193 + fVar222 * fVar251;
        auVar254._0_4_ = fVar155 * local_5b8 + fVar207 * auVar206._16_4_;
        auVar254._4_4_ = fVar192 * fStack_5b4 + fVar208 * auVar206._20_4_;
        auVar254._8_4_ = fVar156 * fStack_5b0 + fVar209 * auVar206._16_4_;
        auVar254._12_4_ = fVar193 * fStack_5ac + fVar222 * auVar206._20_4_;
        auVar111 = vsubps_avx(auVar203,auVar71);
        auVar235 = vmovshdup_avx(auVar294);
        auVar141 = vmovsldup_avx(auVar294);
        auVar204._0_4_ = auVar111._0_4_ * auVar141._0_4_ + auVar71._0_4_ * auVar235._0_4_;
        auVar204._4_4_ = auVar111._4_4_ * auVar141._4_4_ + auVar71._4_4_ * auVar235._4_4_;
        auVar204._8_4_ = auVar111._8_4_ * auVar141._8_4_ + auVar71._8_4_ * auVar235._8_4_;
        auVar204._12_4_ = auVar111._12_4_ * auVar141._12_4_ + auVar71._12_4_ * auVar235._12_4_;
        auVar121 = vmovshdup_avx(auVar204);
        auVar71 = vsubps_avx(auVar184,auVar74);
        auVar130._0_4_ = auVar71._0_4_ * 3.0;
        auVar130._4_4_ = auVar71._4_4_ * 3.0;
        auVar130._8_4_ = auVar71._8_4_ * 3.0;
        auVar130._12_4_ = auVar71._12_4_ * 3.0;
        auVar71 = vsubps_avx(auVar219,auVar184);
        auVar150._0_4_ = auVar71._0_4_ * 3.0;
        auVar150._4_4_ = auVar71._4_4_ * 3.0;
        auVar150._8_4_ = auVar71._8_4_ * 3.0;
        auVar150._12_4_ = auVar71._12_4_ * 3.0;
        auVar71 = vsubps_avx(auVar254,auVar219);
        auVar228._0_4_ = auVar71._0_4_ * 3.0;
        auVar228._4_4_ = auVar71._4_4_ * 3.0;
        auVar228._8_4_ = auVar71._8_4_ * 3.0;
        auVar228._12_4_ = auVar71._12_4_ * 3.0;
        auVar235 = vminps_avx(auVar150,auVar228);
        auVar71 = vmaxps_avx(auVar150,auVar228);
        auVar235 = vminps_avx(auVar130,auVar235);
        auVar71 = vmaxps_avx(auVar130,auVar71);
        auVar141 = vshufpd_avx(auVar235,auVar235,3);
        auVar111 = vshufpd_avx(auVar71,auVar71,3);
        auVar235 = vminps_avx(auVar235,auVar141);
        auVar71 = vmaxps_avx(auVar71,auVar111);
        auVar141 = vshufps_avx(ZEXT416((uint)(1.0 / fVar154)),ZEXT416((uint)(1.0 / fVar154)),0);
        auVar229._0_4_ = auVar141._0_4_ * auVar235._0_4_;
        auVar229._4_4_ = auVar141._4_4_ * auVar235._4_4_;
        auVar229._8_4_ = auVar141._8_4_ * auVar235._8_4_;
        auVar229._12_4_ = auVar141._12_4_ * auVar235._12_4_;
        auVar241._0_4_ = auVar141._0_4_ * auVar71._0_4_;
        auVar241._4_4_ = auVar141._4_4_ * auVar71._4_4_;
        auVar241._8_4_ = auVar141._8_4_ * auVar71._8_4_;
        auVar241._12_4_ = auVar141._12_4_ * auVar71._12_4_;
        auVar67 = ZEXT416((uint)(1.0 / (auVar121._0_4_ - auVar204._0_4_)));
        auVar71 = vshufpd_avx(auVar74,auVar74,3);
        auVar235 = vshufpd_avx(auVar184,auVar184,3);
        auVar141 = vshufpd_avx(auVar219,auVar219,3);
        auVar111 = vshufpd_avx(auVar254,auVar254,3);
        auVar71 = vsubps_avx(auVar71,auVar74);
        auVar100 = vsubps_avx(auVar235,auVar184);
        auVar127 = vsubps_avx(auVar141,auVar219);
        auVar111 = vsubps_avx(auVar111,auVar254);
        auVar235 = vminps_avx(auVar71,auVar100);
        auVar71 = vmaxps_avx(auVar71,auVar100);
        auVar141 = vminps_avx(auVar127,auVar111);
        auVar141 = vminps_avx(auVar235,auVar141);
        auVar235 = vmaxps_avx(auVar127,auVar111);
        auVar71 = vmaxps_avx(auVar71,auVar235);
        auVar235 = vshufps_avx(auVar67,auVar67,0);
        auVar287._0_4_ = auVar235._0_4_ * auVar141._0_4_;
        auVar287._4_4_ = auVar235._4_4_ * auVar141._4_4_;
        auVar287._8_4_ = auVar235._8_4_ * auVar141._8_4_;
        auVar287._12_4_ = auVar235._12_4_ * auVar141._12_4_;
        auVar295._0_4_ = auVar235._0_4_ * auVar71._0_4_;
        auVar295._4_4_ = auVar235._4_4_ * auVar71._4_4_;
        auVar295._8_4_ = auVar235._8_4_ * auVar71._8_4_;
        auVar295._12_4_ = auVar235._12_4_ * auVar71._12_4_;
        auVar71 = vmovsldup_avx(auVar204);
        auVar255._4_12_ = auVar71._4_12_;
        auVar255._0_4_ = fVar191;
        auVar265._4_12_ = auVar204._4_12_;
        auVar265._0_4_ = fVar190;
        auVar151._0_4_ = (fVar191 + fVar190) * 0.5;
        auVar151._4_4_ = (auVar71._4_4_ + auVar204._4_4_) * 0.5;
        auVar151._8_4_ = (auVar71._8_4_ + auVar204._8_4_) * 0.5;
        auVar151._12_4_ = (auVar71._12_4_ + auVar204._12_4_) * 0.5;
        auVar71 = vshufps_avx(auVar151,auVar151,0);
        local_258 = auVar263._0_4_;
        fStack_254 = auVar263._4_4_;
        fStack_250 = auVar263._8_4_;
        fStack_24c = auVar263._12_4_;
        fVar155 = auVar71._0_4_;
        fVar192 = auVar71._4_4_;
        fVar156 = auVar71._8_4_;
        fVar193 = auVar71._12_4_;
        p00.field_0.i[0] = auVar11._0_4_;
        p00.field_0.i[1] = auVar11._4_4_;
        p00.field_0.i[2] = auVar11._8_4_;
        p00.field_0.i[3] = auVar11._12_4_;
        auVar101._0_4_ = fVar155 * local_258 + p00.field_0.v[0];
        auVar101._4_4_ = fVar192 * fStack_254 + p00.field_0.v[1];
        auVar101._8_4_ = fVar156 * fStack_250 + p00.field_0.v[2];
        auVar101._12_4_ = fVar193 * fStack_24c + p00.field_0.v[3];
        local_268 = auVar175._0_4_;
        fStack_264 = auVar175._4_4_;
        fStack_260 = auVar175._8_4_;
        fStack_25c = auVar175._12_4_;
        p01.field_0.i[0] = auVar12._0_4_;
        p01.field_0.i[1] = auVar12._4_4_;
        p01.field_0.i[2] = auVar12._8_4_;
        p01.field_0.i[3] = auVar12._12_4_;
        auVar131._0_4_ = fVar155 * local_268 + p01.field_0.v[0];
        auVar131._4_4_ = fVar192 * fStack_264 + p01.field_0.v[1];
        auVar131._8_4_ = fVar156 * fStack_260 + p01.field_0.v[2];
        auVar131._12_4_ = fVar193 * fStack_25c + p01.field_0.v[3];
        local_278 = auVar176._0_4_;
        fStack_274 = auVar176._4_4_;
        fStack_270 = auVar176._8_4_;
        fStack_26c = auVar176._12_4_;
        p02.field_0.i[0] = auVar13._0_4_;
        p02.field_0.i[1] = auVar13._4_4_;
        p02.field_0.i[2] = auVar13._8_4_;
        p02.field_0.i[3] = auVar13._12_4_;
        auVar185._0_4_ = fVar155 * local_278 + p02.field_0.v[0];
        auVar185._4_4_ = fVar192 * fStack_274 + p02.field_0.v[1];
        auVar185._8_4_ = fVar156 * fStack_270 + p02.field_0.v[2];
        auVar185._12_4_ = fVar193 * fStack_26c + p02.field_0.v[3];
        auVar71 = vsubps_avx(auVar131,auVar101);
        auVar102._0_4_ = auVar101._0_4_ + fVar155 * auVar71._0_4_;
        auVar102._4_4_ = auVar101._4_4_ + fVar192 * auVar71._4_4_;
        auVar102._8_4_ = auVar101._8_4_ + fVar156 * auVar71._8_4_;
        auVar102._12_4_ = auVar101._12_4_ + fVar193 * auVar71._12_4_;
        auVar71 = vsubps_avx(auVar185,auVar131);
        auVar132._0_4_ = auVar131._0_4_ + fVar155 * auVar71._0_4_;
        auVar132._4_4_ = auVar131._4_4_ + fVar192 * auVar71._4_4_;
        auVar132._8_4_ = auVar131._8_4_ + fVar156 * auVar71._8_4_;
        auVar132._12_4_ = auVar131._12_4_ + fVar193 * auVar71._12_4_;
        auVar71 = vsubps_avx(auVar132,auVar102);
        fVar155 = auVar102._0_4_ + fVar155 * auVar71._0_4_;
        fVar192 = auVar102._4_4_ + fVar192 * auVar71._4_4_;
        auVar75._0_8_ = CONCAT44(fVar192,fVar155);
        auVar75._8_4_ = auVar102._8_4_ + fVar156 * auVar71._8_4_;
        auVar75._12_4_ = auVar102._12_4_ + fVar193 * auVar71._12_4_;
        fVar156 = auVar71._0_4_ * 3.0;
        fVar193 = auVar71._4_4_ * 3.0;
        auVar103._0_8_ = CONCAT44(fVar193,fVar156);
        auVar103._8_4_ = auVar71._8_4_ * 3.0;
        auVar103._12_4_ = auVar71._12_4_ * 3.0;
        auVar133._8_8_ = auVar75._0_8_;
        auVar133._0_8_ = auVar75._0_8_;
        auVar71 = vshufpd_avx(auVar75,auVar75,3);
        auVar235 = vshufps_avx(auVar151,auVar151,0x55);
        auVar127 = vsubps_avx(auVar71,auVar133);
        auVar275._0_4_ = auVar127._0_4_ * auVar235._0_4_ + fVar155;
        auVar275._4_4_ = auVar127._4_4_ * auVar235._4_4_ + fVar192;
        auVar275._8_4_ = auVar127._8_4_ * auVar235._8_4_ + fVar155;
        auVar275._12_4_ = auVar127._12_4_ * auVar235._12_4_ + fVar192;
        auVar134._8_8_ = auVar103._0_8_;
        auVar134._0_8_ = auVar103._0_8_;
        auVar71 = vshufpd_avx(auVar103,auVar103,1);
        auVar71 = vsubps_avx(auVar71,auVar134);
        auVar104._0_4_ = auVar71._0_4_ * auVar235._0_4_ + fVar156;
        auVar104._4_4_ = auVar71._4_4_ * auVar235._4_4_ + fVar193;
        auVar104._8_4_ = auVar71._8_4_ * auVar235._8_4_ + fVar156;
        auVar104._12_4_ = auVar71._12_4_ * auVar235._12_4_ + fVar193;
        auVar235 = vmovshdup_avx(auVar104);
        auVar186._0_8_ = auVar235._0_8_ ^ 0x8000000080000000;
        auVar186._8_4_ = auVar235._8_4_ ^ 0x80000000;
        auVar186._12_4_ = auVar235._12_4_ ^ 0x80000000;
        auVar141 = vmovshdup_avx(auVar127);
        auVar71 = vunpcklps_avx(auVar141,auVar186);
        auVar111 = vshufps_avx(auVar71,auVar186,4);
        auVar76._0_8_ = auVar127._0_8_ ^ 0x8000000080000000;
        auVar76._8_4_ = -auVar127._8_4_;
        auVar76._12_4_ = -auVar127._12_4_;
        auVar71 = vmovlhps_avx(auVar76,auVar104);
        auVar100 = vshufps_avx(auVar71,auVar104,8);
        auVar71 = ZEXT416((uint)(auVar104._0_4_ * auVar141._0_4_ - auVar127._0_4_ * auVar235._0_4_))
        ;
        auVar235 = vshufps_avx(auVar71,auVar71,0);
        auVar71 = vdivps_avx(auVar111,auVar235);
        auVar235 = vdivps_avx(auVar100,auVar235);
        auVar100 = vinsertps_avx(auVar229,auVar287,0x1c);
        auVar127 = vinsertps_avx(auVar241,auVar295,0x1c);
        auVar67 = vinsertps_avx(auVar287,auVar229,0x4c);
        auVar95 = vinsertps_avx(auVar295,auVar241,0x4c);
        auVar141 = vmovsldup_avx(auVar71);
        auVar135._0_4_ = auVar141._0_4_ * auVar100._0_4_;
        auVar135._4_4_ = auVar141._4_4_ * auVar100._4_4_;
        auVar135._8_4_ = auVar141._8_4_ * auVar100._8_4_;
        auVar135._12_4_ = auVar141._12_4_ * auVar100._12_4_;
        auVar105._0_4_ = auVar127._0_4_ * auVar141._0_4_;
        auVar105._4_4_ = auVar127._4_4_ * auVar141._4_4_;
        auVar105._8_4_ = auVar127._8_4_ * auVar141._8_4_;
        auVar105._12_4_ = auVar127._12_4_ * auVar141._12_4_;
        auVar111 = vminps_avx(auVar135,auVar105);
        auVar141 = vmaxps_avx(auVar105,auVar135);
        auVar96 = vmovsldup_avx(auVar235);
        auVar296._0_4_ = auVar67._0_4_ * auVar96._0_4_;
        auVar296._4_4_ = auVar67._4_4_ * auVar96._4_4_;
        auVar296._8_4_ = auVar67._8_4_ * auVar96._8_4_;
        auVar296._12_4_ = auVar67._12_4_ * auVar96._12_4_;
        auVar136._0_4_ = auVar95._0_4_ * auVar96._0_4_;
        auVar136._4_4_ = auVar95._4_4_ * auVar96._4_4_;
        auVar136._8_4_ = auVar95._8_4_ * auVar96._8_4_;
        auVar136._12_4_ = auVar95._12_4_ * auVar96._12_4_;
        auVar96 = vminps_avx(auVar296,auVar136);
        auVar166._0_4_ = auVar111._0_4_ + auVar96._0_4_;
        auVar166._4_4_ = auVar111._4_4_ + auVar96._4_4_;
        auVar166._8_4_ = auVar111._8_4_ + auVar96._8_4_;
        auVar166._12_4_ = auVar111._12_4_ + auVar96._12_4_;
        auVar111 = vmaxps_avx(auVar136,auVar296);
        auVar96 = vsubps_avx(auVar255,auVar151);
        auVar122 = vsubps_avx(auVar265,auVar151);
        auVar106._0_4_ = auVar141._0_4_ + auVar111._0_4_;
        auVar106._4_4_ = auVar141._4_4_ + auVar111._4_4_;
        auVar106._8_4_ = auVar141._8_4_ + auVar111._8_4_;
        auVar106._12_4_ = auVar141._12_4_ + auVar111._12_4_;
        auVar137._8_8_ = 0x3f800000;
        auVar137._0_8_ = 0x3f800000;
        auVar141 = vsubps_avx(auVar137,auVar106);
        auVar111 = vsubps_avx(auVar137,auVar166);
        fVar209 = auVar96._0_4_;
        auVar167._0_4_ = fVar209 * auVar141._0_4_;
        fVar222 = auVar96._4_4_;
        auVar167._4_4_ = fVar222 * auVar141._4_4_;
        fVar233 = auVar96._8_4_;
        auVar167._8_4_ = fVar233 * auVar141._8_4_;
        fVar251 = auVar96._12_4_;
        auVar167._12_4_ = fVar251 * auVar141._12_4_;
        fVar156 = auVar122._0_4_;
        auVar107._0_4_ = fVar156 * auVar141._0_4_;
        fVar193 = auVar122._4_4_;
        auVar107._4_4_ = fVar193 * auVar141._4_4_;
        fVar207 = auVar122._8_4_;
        auVar107._8_4_ = fVar207 * auVar141._8_4_;
        fVar208 = auVar122._12_4_;
        auVar107._12_4_ = fVar208 * auVar141._12_4_;
        auVar266._0_4_ = fVar209 * auVar111._0_4_;
        auVar266._4_4_ = fVar222 * auVar111._4_4_;
        auVar266._8_4_ = fVar233 * auVar111._8_4_;
        auVar266._12_4_ = fVar251 * auVar111._12_4_;
        auVar138._0_4_ = fVar156 * auVar111._0_4_;
        auVar138._4_4_ = fVar193 * auVar111._4_4_;
        auVar138._8_4_ = fVar207 * auVar111._8_4_;
        auVar138._12_4_ = fVar208 * auVar111._12_4_;
        auVar141 = vminps_avx(auVar167,auVar266);
        auVar111 = vminps_avx(auVar107,auVar138);
        auVar96 = vminps_avx(auVar141,auVar111);
        auVar141 = vmaxps_avx(auVar266,auVar167);
        auVar111 = vmaxps_avx(auVar138,auVar107);
        auVar122 = vshufps_avx(auVar151,auVar151,0x54);
        auVar111 = vmaxps_avx(auVar111,auVar141);
        auVar123 = vshufps_avx(auVar275,auVar275,0);
        auVar148 = vshufps_avx(auVar275,auVar275,0x55);
        auVar141 = vhaddps_avx(auVar96,auVar96);
        auVar111 = vhaddps_avx(auVar111,auVar111);
        auVar152._0_4_ = auVar123._0_4_ * auVar71._0_4_ + auVar148._0_4_ * auVar235._0_4_;
        auVar152._4_4_ = auVar123._4_4_ * auVar71._4_4_ + auVar148._4_4_ * auVar235._4_4_;
        auVar152._8_4_ = auVar123._8_4_ * auVar71._8_4_ + auVar148._8_4_ * auVar235._8_4_;
        auVar152._12_4_ = auVar123._12_4_ * auVar71._12_4_ + auVar148._12_4_ * auVar235._12_4_;
        auVar96 = vsubps_avx(auVar122,auVar152);
        fVar155 = auVar96._0_4_ + auVar141._0_4_;
        fVar192 = auVar96._0_4_ + auVar111._0_4_;
        auVar141 = vmaxss_avx(ZEXT416((uint)fVar191),ZEXT416((uint)fVar155));
        auVar111 = vminss_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar190));
      } while (auVar111._0_4_ < auVar141._0_4_);
      auVar141 = vmovshdup_avx(auVar71);
      auVar77._0_4_ = auVar141._0_4_ * auVar100._0_4_;
      auVar77._4_4_ = auVar141._4_4_ * auVar100._4_4_;
      auVar77._8_4_ = auVar141._8_4_ * auVar100._8_4_;
      auVar77._12_4_ = auVar141._12_4_ * auVar100._12_4_;
      auVar108._0_4_ = auVar127._0_4_ * auVar141._0_4_;
      auVar108._4_4_ = auVar127._4_4_ * auVar141._4_4_;
      auVar108._8_4_ = auVar127._8_4_ * auVar141._8_4_;
      auVar108._12_4_ = auVar127._12_4_ * auVar141._12_4_;
      auVar111 = vminps_avx(auVar77,auVar108);
      auVar141 = vmaxps_avx(auVar108,auVar77);
      auVar100 = vmovshdup_avx(auVar235);
      auVar168._0_4_ = auVar67._0_4_ * auVar100._0_4_;
      auVar168._4_4_ = auVar67._4_4_ * auVar100._4_4_;
      auVar168._8_4_ = auVar67._8_4_ * auVar100._8_4_;
      auVar168._12_4_ = auVar67._12_4_ * auVar100._12_4_;
      auVar109._0_4_ = auVar95._0_4_ * auVar100._0_4_;
      auVar109._4_4_ = auVar95._4_4_ * auVar100._4_4_;
      auVar109._8_4_ = auVar95._8_4_ * auVar100._8_4_;
      auVar109._12_4_ = auVar95._12_4_ * auVar100._12_4_;
      auVar100 = vminps_avx(auVar168,auVar109);
      auVar139._0_4_ = auVar111._0_4_ + auVar100._0_4_;
      auVar139._4_4_ = auVar111._4_4_ + auVar100._4_4_;
      auVar139._8_4_ = auVar111._8_4_ + auVar100._8_4_;
      auVar139._12_4_ = auVar111._12_4_ + auVar100._12_4_;
      auVar111 = vmaxps_avx(auVar109,auVar168);
      auVar78._0_4_ = auVar141._0_4_ + auVar111._0_4_;
      auVar78._4_4_ = auVar141._4_4_ + auVar111._4_4_;
      auVar78._8_4_ = auVar141._8_4_ + auVar111._8_4_;
      auVar78._12_4_ = auVar141._12_4_ + auVar111._12_4_;
      auVar141 = vsubps_avx(auVar202,auVar78);
      auVar111 = vsubps_avx(auVar202,auVar139);
      auVar140._0_4_ = fVar209 * auVar141._0_4_;
      auVar140._4_4_ = fVar222 * auVar141._4_4_;
      auVar140._8_4_ = fVar233 * auVar141._8_4_;
      auVar140._12_4_ = fVar251 * auVar141._12_4_;
      auVar169._0_4_ = fVar209 * auVar111._0_4_;
      auVar169._4_4_ = fVar222 * auVar111._4_4_;
      auVar169._8_4_ = fVar233 * auVar111._8_4_;
      auVar169._12_4_ = fVar251 * auVar111._12_4_;
      auVar79._0_4_ = fVar156 * auVar141._0_4_;
      auVar79._4_4_ = fVar193 * auVar141._4_4_;
      auVar79._8_4_ = fVar207 * auVar141._8_4_;
      auVar79._12_4_ = fVar208 * auVar141._12_4_;
      auVar110._0_4_ = fVar156 * auVar111._0_4_;
      auVar110._4_4_ = fVar193 * auVar111._4_4_;
      auVar110._8_4_ = fVar207 * auVar111._8_4_;
      auVar110._12_4_ = fVar208 * auVar111._12_4_;
      auVar141 = vminps_avx(auVar140,auVar169);
      auVar111 = vminps_avx(auVar79,auVar110);
      auVar141 = vminps_avx(auVar141,auVar111);
      auVar111 = vmaxps_avx(auVar169,auVar140);
      auVar100 = vmaxps_avx(auVar110,auVar79);
      auVar141 = vhaddps_avx(auVar141,auVar141);
      auVar111 = vmaxps_avx(auVar100,auVar111);
      auVar111 = vhaddps_avx(auVar111,auVar111);
      auVar100 = vmovshdup_avx(auVar96);
      auVar127 = ZEXT416((uint)(auVar100._0_4_ + auVar141._0_4_));
      auVar141 = vmaxss_avx(auVar204,auVar127);
      auVar100 = ZEXT416((uint)(auVar100._0_4_ + auVar111._0_4_));
      auVar111 = vminss_avx(auVar100,auVar121);
    } while (auVar111._0_4_ < auVar141._0_4_);
    uVar52 = 0;
    if ((fVar191 < fVar155) && (fVar192 < fVar190)) {
      auVar141 = vcmpps_avx(auVar100,auVar121,1);
      auVar111 = vcmpps_avx(auVar204,auVar127,1);
      auVar141 = vandps_avx(auVar111,auVar141);
      uVar52 = auVar141._0_4_;
    }
    auVar230._8_4_ = 0x7fffffff;
    auVar230._0_8_ = 0x7fffffff7fffffff;
    auVar230._12_4_ = 0x7fffffff;
    p03.field_0.i[0] = auVar63._0_4_;
    p03.field_0.i[1] = auVar63._4_4_;
    p03.field_0.i[2] = auVar63._8_4_;
    p03.field_0.i[3] = auVar63._12_4_;
    if ((3 < uVar59 || fVar154 < 0.001) || (uVar52 & 1) != 0) {
      lVar55 = 0xc9;
      do {
        lVar55 = lVar55 + -1;
        if (lVar55 == 0) goto LAB_007f9c6c;
        fVar154 = auVar96._0_4_;
        fVar190 = 1.0 - fVar154;
        auVar141 = ZEXT416((uint)(fVar190 * fVar190 * fVar190));
        auVar141 = vshufps_avx(auVar141,auVar141,0);
        auVar111 = ZEXT416((uint)(fVar154 * 3.0 * fVar190 * fVar190));
        auVar111 = vshufps_avx(auVar111,auVar111,0);
        auVar100 = ZEXT416((uint)(fVar190 * fVar154 * fVar154 * 3.0));
        auVar100 = vshufps_avx(auVar100,auVar100,0);
        auVar127 = ZEXT416((uint)(fVar154 * fVar154 * fVar154));
        auVar127 = vshufps_avx(auVar127,auVar127,0);
        fVar190 = p00.field_0.v[0] * auVar141._0_4_ +
                  p01.field_0.v[0] * auVar111._0_4_ +
                  p03.field_0.v[0] * auVar127._0_4_ + p02.field_0.v[0] * auVar100._0_4_;
        fVar154 = p00.field_0.v[1] * auVar141._4_4_ +
                  p01.field_0.v[1] * auVar111._4_4_ +
                  p03.field_0.v[1] * auVar127._4_4_ + p02.field_0.v[1] * auVar100._4_4_;
        auVar80._0_8_ = CONCAT44(fVar154,fVar190);
        auVar80._8_4_ =
             p00.field_0.v[2] * auVar141._8_4_ +
             p01.field_0.v[2] * auVar111._8_4_ +
             p03.field_0.v[2] * auVar127._8_4_ + p02.field_0.v[2] * auVar100._8_4_;
        auVar80._12_4_ =
             p00.field_0.v[3] * auVar141._12_4_ +
             p01.field_0.v[3] * auVar111._12_4_ +
             p03.field_0.v[3] * auVar127._12_4_ + p02.field_0.v[3] * auVar100._12_4_;
        auVar112._8_8_ = auVar80._0_8_;
        auVar112._0_8_ = auVar80._0_8_;
        auVar111 = vshufpd_avx(auVar80,auVar80,1);
        auVar141 = vmovshdup_avx(auVar96);
        auVar111 = vsubps_avx(auVar111,auVar112);
        auVar81._0_4_ = auVar141._0_4_ * auVar111._0_4_ + fVar190;
        auVar81._4_4_ = auVar141._4_4_ * auVar111._4_4_ + fVar154;
        auVar81._8_4_ = auVar141._8_4_ * auVar111._8_4_ + fVar190;
        auVar81._12_4_ = auVar141._12_4_ * auVar111._12_4_ + fVar154;
        auVar141 = vshufps_avx(auVar81,auVar81,0);
        auVar111 = vshufps_avx(auVar81,auVar81,0x55);
        auVar113._0_4_ = auVar71._0_4_ * auVar141._0_4_ + auVar235._0_4_ * auVar111._0_4_;
        auVar113._4_4_ = auVar71._4_4_ * auVar141._4_4_ + auVar235._4_4_ * auVar111._4_4_;
        auVar113._8_4_ = auVar71._8_4_ * auVar141._8_4_ + auVar235._8_4_ * auVar111._8_4_;
        auVar113._12_4_ = auVar71._12_4_ * auVar141._12_4_ + auVar235._12_4_ * auVar111._12_4_;
        auVar96 = vsubps_avx(auVar96,auVar113);
        auVar141 = vandps_avx(auVar230,auVar81);
        auVar111 = vshufps_avx(auVar141,auVar141,0xf5);
        auVar141 = vmaxss_avx(auVar111,auVar141);
      } while (fVar144 <= auVar141._0_4_);
      fVar190 = auVar96._0_4_;
      if ((0.0 <= fVar190) && (fVar190 <= 1.0)) {
        auVar71 = vmovshdup_avx(auVar96);
        fVar154 = auVar71._0_4_;
        if ((0.0 <= fVar154) && (fVar154 <= 1.0)) {
          auVar71 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                  ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar95 = vinsertps_avx(auVar71,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
          auVar71 = vdpps_avx(auVar95,auVar94,0x7f);
          auVar235 = vdpps_avx(auVar95,auVar93,0x7f);
          auVar141 = vdpps_avx(auVar95,auVar92,0x7f);
          auVar111 = vdpps_avx(auVar95,auVar119,0x7f);
          auVar100 = vdpps_avx(auVar95,auVar120,0x7f);
          auVar127 = vdpps_avx(auVar95,auVar145,0x7f);
          auVar67 = vdpps_avx(auVar95,auVar157,0x7f);
          auVar95 = vdpps_avx(auVar95,auVar158,0x7f);
          fVar193 = 1.0 - fVar154;
          fVar207 = 1.0 - fVar190;
          fVar191 = auVar96._4_4_;
          fVar155 = auVar96._8_4_;
          fVar192 = auVar96._12_4_;
          fVar156 = fVar207 * fVar190 * fVar190 * 3.0;
          auVar220._0_4_ = fVar190 * fVar190 * fVar190;
          auVar220._4_4_ = fVar191 * fVar191 * fVar191;
          auVar220._8_4_ = fVar155 * fVar155 * fVar155;
          auVar220._12_4_ = fVar192 * fVar192 * fVar192;
          fVar155 = fVar207 * fVar207 * fVar190 * 3.0;
          fVar192 = fVar207 * fVar207 * fVar207;
          fVar191 = fVar192 * (fVar193 * auVar71._0_4_ + fVar154 * auVar100._0_4_) +
                    (fVar193 * auVar235._0_4_ + auVar127._0_4_ * fVar154) * fVar155 +
                    fVar156 * (auVar67._0_4_ * fVar154 + fVar193 * auVar141._0_4_) +
                    auVar220._0_4_ * (fVar193 * auVar111._0_4_ + fVar154 * auVar95._0_4_);
          auVar71 = ZEXT416((uint)fVar191);
          if (((fVar174 <= fVar191) &&
              (fVar193 = *(float *)(ray + k * 4 + 0x80), fVar191 <= fVar193)) &&
             (pGVar6 = (context->scene->geometries).items[uVar53].ptr,
             (pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
            local_1e8 = vshufps_avx(auVar96,auVar96,0x55);
            auVar242._8_4_ = 0x3f800000;
            auVar242._0_8_ = 0x3f8000003f800000;
            auVar242._12_4_ = 0x3f800000;
            auVar235 = vsubps_avx(auVar242,local_1e8);
            fVar208 = local_1e8._0_4_;
            fVar209 = local_1e8._4_4_;
            fVar222 = local_1e8._8_4_;
            fVar233 = local_1e8._12_4_;
            local_338 = auVar146._0_4_;
            fStack_334 = auVar146._4_4_;
            fStack_330 = auVar146._8_4_;
            fStack_32c = auVar146._12_4_;
            fVar251 = auVar235._0_4_;
            fVar259 = auVar235._4_4_;
            fVar261 = auVar235._8_4_;
            fVar269 = auVar235._12_4_;
            auVar256._0_4_ = fVar208 * auVar273._0_4_ + fVar251 * auVar62._0_4_;
            auVar256._4_4_ = fVar209 * auVar273._4_4_ + fVar259 * auVar62._4_4_;
            auVar256._8_4_ = fVar222 * auVar273._8_4_ + fVar261 * auVar62._8_4_;
            auVar256._12_4_ = fVar233 * auVar273._12_4_ + fVar269 * auVar62._12_4_;
            auVar267._0_4_ = fVar208 * auVar65._0_4_ + fVar251 * auVar285._0_4_;
            auVar267._4_4_ = fVar209 * auVar65._4_4_ + fVar259 * auVar285._4_4_;
            auVar267._8_4_ = fVar222 * auVar65._8_4_ + fVar261 * auVar285._8_4_;
            auVar267._12_4_ = fVar233 * auVar65._12_4_ + fVar269 * auVar285._12_4_;
            local_428 = auVar118._0_4_;
            fStack_424 = auVar118._4_4_;
            fStack_420 = auVar118._8_4_;
            fStack_41c = auVar118._12_4_;
            auVar276._0_4_ = fVar208 * local_338 + fVar251 * local_428;
            auVar276._4_4_ = fVar209 * fStack_334 + fVar259 * fStack_424;
            auVar276._8_4_ = fVar222 * fStack_330 + fVar261 * fStack_420;
            auVar276._12_4_ = fVar233 * fStack_32c + fVar269 * fStack_41c;
            local_408 = auVar64._0_4_;
            fStack_404 = auVar64._4_4_;
            fStack_400 = auVar64._8_4_;
            fStack_3fc = auVar64._12_4_;
            auVar243._0_4_ = fVar208 * fVar232 + fVar251 * local_408;
            auVar243._4_4_ = fVar209 * fVar234 + fVar259 * fStack_404;
            auVar243._8_4_ = fVar222 * fVar258 + fVar261 * fStack_400;
            auVar243._12_4_ = fVar233 * fVar260 + fVar269 * fStack_3fc;
            auVar100 = vsubps_avx(auVar267,auVar256);
            auVar127 = vsubps_avx(auVar276,auVar267);
            auVar67 = vsubps_avx(auVar243,auVar276);
            local_1f8 = vshufps_avx(auVar96,auVar96,0);
            fVar233 = local_1f8._0_4_;
            fVar251 = local_1f8._4_4_;
            fVar259 = local_1f8._8_4_;
            fVar261 = local_1f8._12_4_;
            auVar235 = vshufps_avx(ZEXT416((uint)fVar207),ZEXT416((uint)fVar207),0);
            fVar207 = auVar235._0_4_;
            fVar208 = auVar235._4_4_;
            fVar209 = auVar235._8_4_;
            fVar222 = auVar235._12_4_;
            auVar235 = vshufps_avx(auVar220,auVar220,0);
            local_378 = auVar211._0_4_;
            fStack_374 = auVar211._4_4_;
            fStack_370 = auVar211._8_4_;
            fStack_36c = auVar211._12_4_;
            auVar141 = vshufps_avx(ZEXT416((uint)fVar156),ZEXT416((uint)fVar156),0);
            local_368 = auVar210._0_4_;
            fStack_364 = auVar210._4_4_;
            fStack_360 = auVar210._8_4_;
            fStack_35c = auVar210._12_4_;
            auVar111 = vshufps_avx(ZEXT416((uint)fVar155),ZEXT416((uint)fVar155),0);
            local_358 = auVar195._0_4_;
            fStack_354 = auVar195._4_4_;
            fStack_350 = auVar195._8_4_;
            fStack_34c = auVar195._12_4_;
            auVar205._0_4_ =
                 (fVar207 * (fVar207 * auVar100._0_4_ + fVar233 * auVar127._0_4_) +
                 fVar233 * (fVar207 * auVar127._0_4_ + fVar233 * auVar67._0_4_)) * 3.0;
            auVar205._4_4_ =
                 (fVar208 * (fVar208 * auVar100._4_4_ + fVar251 * auVar127._4_4_) +
                 fVar251 * (fVar208 * auVar127._4_4_ + fVar251 * auVar67._4_4_)) * 3.0;
            auVar205._8_4_ =
                 (fVar209 * (fVar209 * auVar100._8_4_ + fVar259 * auVar127._8_4_) +
                 fVar259 * (fVar209 * auVar127._8_4_ + fVar259 * auVar67._8_4_)) * 3.0;
            auVar205._12_4_ =
                 (fVar222 * (fVar222 * auVar100._12_4_ + fVar261 * auVar127._12_4_) +
                 fVar261 * (fVar222 * auVar127._12_4_ + fVar261 * auVar67._12_4_)) * 3.0;
            auVar100 = vshufps_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),0);
            local_348 = auVar194._0_4_;
            fStack_344 = auVar194._4_4_;
            fStack_340 = auVar194._8_4_;
            fStack_33c = auVar194._12_4_;
            auVar170._0_4_ =
                 auVar100._0_4_ * local_348 +
                 auVar111._0_4_ * local_358 +
                 auVar235._0_4_ * local_378 + auVar141._0_4_ * local_368;
            auVar170._4_4_ =
                 auVar100._4_4_ * fStack_344 +
                 auVar111._4_4_ * fStack_354 +
                 auVar235._4_4_ * fStack_374 + auVar141._4_4_ * fStack_364;
            auVar170._8_4_ =
                 auVar100._8_4_ * fStack_340 +
                 auVar111._8_4_ * fStack_350 +
                 auVar235._8_4_ * fStack_370 + auVar141._8_4_ * fStack_360;
            auVar170._12_4_ =
                 auVar100._12_4_ * fStack_33c +
                 auVar111._12_4_ * fStack_34c +
                 auVar235._12_4_ * fStack_36c + auVar141._12_4_ * fStack_35c;
            auVar235 = vshufps_avx(auVar205,auVar205,0xc9);
            auVar187._0_4_ = auVar170._0_4_ * auVar235._0_4_;
            auVar187._4_4_ = auVar170._4_4_ * auVar235._4_4_;
            auVar187._8_4_ = auVar170._8_4_ * auVar235._8_4_;
            auVar187._12_4_ = auVar170._12_4_ * auVar235._12_4_;
            auVar235 = vshufps_avx(auVar170,auVar170,0xc9);
            auVar171._0_4_ = auVar205._0_4_ * auVar235._0_4_;
            auVar171._4_4_ = auVar205._4_4_ * auVar235._4_4_;
            auVar171._8_4_ = auVar205._8_4_ * auVar235._8_4_;
            auVar171._12_4_ = auVar205._12_4_ * auVar235._12_4_;
            auVar235 = vsubps_avx(auVar171,auVar187);
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              *(float *)(ray + k * 4 + 0x80) = fVar191;
              uVar57 = vextractps_avx(auVar235,1);
              *(undefined4 *)(ray + k * 4 + 0xc0) = uVar57;
              uVar57 = vextractps_avx(auVar235,2);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar57;
              *(int *)(ray + k * 4 + 0xe0) = auVar235._0_4_;
              *(float *)(ray + k * 4 + 0xf0) = fVar190;
              *(float *)(ray + k * 4 + 0x100) = fVar154;
              *(int *)(ray + k * 4 + 0x110) = (int)local_478;
              *(uint *)(ray + k * 4 + 0x120) = uVar53;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              auVar141 = vshufps_avx(auVar235,auVar235,0x55);
              auVar111 = vshufps_avx(auVar235,auVar235,0xaa);
              local_208 = vshufps_avx(auVar235,auVar235,0);
              local_228[0] = (RTCHitN)auVar141[0];
              local_228[1] = (RTCHitN)auVar141[1];
              local_228[2] = (RTCHitN)auVar141[2];
              local_228[3] = (RTCHitN)auVar141[3];
              local_228[4] = (RTCHitN)auVar141[4];
              local_228[5] = (RTCHitN)auVar141[5];
              local_228[6] = (RTCHitN)auVar141[6];
              local_228[7] = (RTCHitN)auVar141[7];
              local_228[8] = (RTCHitN)auVar141[8];
              local_228[9] = (RTCHitN)auVar141[9];
              local_228[10] = (RTCHitN)auVar141[10];
              local_228[0xb] = (RTCHitN)auVar141[0xb];
              local_228[0xc] = (RTCHitN)auVar141[0xc];
              local_228[0xd] = (RTCHitN)auVar141[0xd];
              local_228[0xe] = (RTCHitN)auVar141[0xe];
              local_228[0xf] = (RTCHitN)auVar141[0xf];
              local_218 = auVar111;
              local_3a8 = auVar10._0_8_;
              uStack_3a0 = auVar10._8_8_;
              local_1d8 = local_3a8;
              uStack_1d0 = uStack_3a0;
              local_1c8 = auVar216;
              vcmpps_avx(ZEXT1632(auVar216),ZEXT1632(auVar216),0xf);
              uStack_1b4 = context->user->instID[0];
              local_1b8 = uStack_1b4;
              uStack_1b0 = uStack_1b4;
              uStack_1ac = uStack_1b4;
              uStack_1a8 = context->user->instPrimID[0];
              uStack_1a4 = uStack_1a8;
              uStack_1a0 = uStack_1a8;
              uStack_19c = uStack_1a8;
              *(float *)(ray + k * 4 + 0x80) = fVar191;
              local_498 = *local_480;
              args.valid = (int *)local_498;
              args.geometryUserPtr = pGVar6->userPtr;
              args.context = context->user;
              args.hit = local_228;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar6->intersectionFilterN)(&args);
                auVar298._8_56_ = extraout_var;
                auVar298._0_8_ = extraout_XMM1_Qa;
                auVar71 = auVar298._0_16_;
              }
              if (local_498 == (undefined1  [16])0x0) {
                auVar235 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar71 = vpcmpeqd_avx(auVar71,auVar71);
                auVar235 = auVar235 ^ auVar71;
              }
              else {
                p_Var9 = context->args->filter;
                auVar71 = vpcmpeqd_avx(auVar111,auVar111);
                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var9)(&args);
                  auVar71 = vpcmpeqd_avx(auVar71,auVar71);
                }
                auVar141 = vpcmpeqd_avx(local_498,_DAT_01f45a50);
                auVar235 = auVar141 ^ auVar71;
                if (local_498 != (undefined1  [16])0x0) {
                  auVar141 = auVar141 ^ auVar71;
                  auVar71 = vmaskmovps_avx(auVar141,*(undefined1 (*) [16])args.hit);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar71;
                  auVar71 = vmaskmovps_avx(auVar141,*(undefined1 (*) [16])(args.hit + 0x10));
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar71;
                  auVar71 = vmaskmovps_avx(auVar141,*(undefined1 (*) [16])(args.hit + 0x20));
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar71;
                  auVar71 = vmaskmovps_avx(auVar141,*(undefined1 (*) [16])(args.hit + 0x30));
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar71;
                  auVar71 = vmaskmovps_avx(auVar141,*(undefined1 (*) [16])(args.hit + 0x40));
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar71;
                  auVar71 = vmaskmovps_avx(auVar141,*(undefined1 (*) [16])(args.hit + 0x50));
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar71;
                  auVar71 = vmaskmovps_avx(auVar141,*(undefined1 (*) [16])(args.hit + 0x60));
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar71;
                  auVar71 = vmaskmovps_avx(auVar141,*(undefined1 (*) [16])(args.hit + 0x70));
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar71;
                  auVar71 = vmaskmovps_avx(auVar141,*(undefined1 (*) [16])(args.hit + 0x80));
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar71;
                }
              }
              auVar82._8_8_ = 0x100000001;
              auVar82._0_8_ = 0x100000001;
              if ((auVar82 & auVar235) == (undefined1  [16])0x0) {
                *(float *)(ray + k * 4 + 0x80) = fVar193;
              }
            }
          }
        }
      }
      goto LAB_007f9c6c;
    }
    auVar71 = vinsertps_avx(ZEXT416((uint)fVar191),ZEXT416((uint)fVar190),0x10);
    auVar305 = ZEXT1664(auVar71);
    auVar298 = ZEXT1664(auVar204);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }